

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  BVH *bvh;
  Ref<embree::Geometry> *pRVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  int iVar24;
  uint uVar25;
  int iVar26;
  AABBNodeMB4D *node1;
  ulong uVar27;
  GridSOA *pGVar28;
  GridSOA *pGVar29;
  GridSOA *pGVar30;
  RTCRayN *pRVar31;
  uint uVar32;
  undefined4 uVar33;
  ulong uVar34;
  size_t sVar35;
  Intersectors *pIVar36;
  long lVar37;
  Primitive_conflict3 *prim;
  NodeRef root;
  ulong uVar38;
  GridSOA *pGVar39;
  long lVar40;
  GridSOA *pGVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar45;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar46;
  ulong uVar47;
  ulong uVar48;
  long lVar49;
  GridSOA *pGVar50;
  long lVar51;
  NodeRef *pNVar52;
  bool bVar53;
  bool bVar54;
  float fVar55;
  float fVar76;
  float fVar77;
  vint4 ai;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar78;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar89;
  int iVar90;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  int iVar91;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  float fVar93;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar113;
  float fVar116;
  vint4 ai_1;
  undefined1 auVar108 [16];
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar121;
  float fVar122;
  float fVar127;
  float fVar129;
  vint4 ai_3;
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar133;
  float fVar138;
  float fVar139;
  vint4 bi;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar140;
  float fVar146;
  float fVar147;
  vint4 bi_3;
  float fVar148;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar149;
  float fVar160;
  float fVar162;
  vint4 bi_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar150;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  uint uVar166;
  uint uVar167;
  float fVar168;
  float fVar169;
  uint uVar173;
  uint uVar177;
  vint4 ai_2;
  uint uVar174;
  float fVar175;
  float fVar176;
  float fVar178;
  float fVar179;
  uint uVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar183;
  float fVar184;
  uint uVar185;
  float fVar186;
  float fVar187;
  float fVar191;
  float fVar196;
  vint4 bi_2;
  float fVar192;
  uint uVar193;
  uint uVar197;
  float fVar200;
  float fVar201;
  uint uVar202;
  undefined1 auVar188 [16];
  float fVar194;
  float fVar195;
  float fVar198;
  float fVar199;
  float fVar203;
  float fVar204;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar205;
  float fVar206;
  float fVar209;
  float fVar212;
  float fVar214;
  undefined1 auVar207 [16];
  float fVar210;
  float fVar211;
  float fVar213;
  float fVar215;
  float fVar216;
  undefined1 auVar208 [16];
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar219 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  TravRayK<4,_false> *tray_00;
  float local_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  undefined1 local_1c28 [16];
  GridSOA *local_1be0;
  float local_1bd8;
  float fStack_1bd4;
  float fStack_1bd0;
  float fStack_1bcc;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_1b88;
  undefined1 local_1b28 [16];
  Intersectors *local_1b18;
  GridSOA *local_1b10;
  GridSOA *local_1b08;
  GridSOA *local_1b00;
  GridSOA *local_1af8;
  GridSOA *local_1af0;
  GridSOA *local_1ae8;
  int local_1adc;
  undefined1 local_1ad8 [16];
  undefined1 local_1ac8 [8];
  float fStack_1ac0;
  float fStack_1abc;
  undefined1 local_1ab8 [8];
  float fStack_1ab0;
  float fStack_1aac;
  undefined1 local_1aa8 [8];
  float fStack_1aa0;
  float fStack_1a9c;
  float local_1a98;
  float fStack_1a94;
  float fStack_1a90;
  float fStack_1a8c;
  vbool<4> terminated;
  Precalculations pre;
  GridSOA *local_1a48;
  GridSOA *local_1a40;
  GridSOA *local_1a38;
  GridSOA *local_1a30;
  RTCFilterFunctionNArguments args;
  undefined8 uStack_19f0;
  undefined8 uStack_19e0;
  vint<4> vitime;
  undefined8 local_1998;
  undefined8 uStack_1990;
  undefined8 local_1988;
  undefined8 uStack_1980;
  undefined1 local_1978 [16];
  float local_1968;
  float fStack_1964;
  float fStack_1960;
  float fStack_195c;
  float local_1958;
  float fStack_1954;
  float fStack_1950;
  float fStack_194c;
  undefined4 local_1948;
  undefined4 uStack_1944;
  undefined4 uStack_1940;
  undefined4 uStack_193c;
  uint local_1938;
  uint uStack_1934;
  uint uStack_1930;
  uint uStack_192c;
  uint local_1928;
  uint uStack_1924;
  uint uStack_1920;
  uint uStack_191c;
  uint local_1918;
  uint uStack_1914;
  uint uStack_1910;
  uint uStack_190c;
  TravRayK<4,_false> tray;
  uint local_17f8;
  uint uStack_17f4;
  uint uStack_17f0;
  uint uStack_17ec;
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  float local_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  undefined8 local_17a8;
  undefined8 uStack_17a0;
  undefined8 local_1798;
  undefined8 uStack_1790;
  undefined8 local_1788;
  undefined8 uStack_1780;
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  undefined8 local_1738;
  undefined8 uStack_1730;
  undefined8 local_1728;
  undefined8 uStack_1720;
  undefined8 local_1718;
  undefined8 uStack_1710;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar170 [16];
  
  auVar88 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar95._8_4_ = 0xffffffff;
    auVar95._0_8_ = 0xffffffffffffffff;
    auVar95._12_4_ = 0xffffffff;
    auVar108 = *(undefined1 (*) [16])(ray + 0x80);
    auVar154._0_12_ = ZEXT812(0);
    auVar154._12_4_ = 0;
    uVar166 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar108._0_4_);
    uVar173 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar108._4_4_);
    auVar170._0_8_ = CONCAT44(uVar173,uVar166);
    auVar170._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar108._8_4_);
    auVar170._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar108._12_4_);
    iVar24 = movmskps((int)bvh,auVar170);
    if (iVar24 != 0) {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar183 = (float)DAT_01ff1d40;
      fVar191 = DAT_01ff1d40._4_4_;
      fVar196 = DAT_01ff1d40._8_4_;
      fVar200 = DAT_01ff1d40._12_4_;
      auVar57._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar191);
      auVar57._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar183);
      auVar57._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar196);
      auVar57._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar200);
      auVar151 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01ff1d40,auVar57
                         );
      auVar79._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar191);
      auVar79._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar183);
      auVar79._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar196);
      auVar79._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar200);
      auVar79 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01ff1d40,auVar79)
      ;
      auVar56._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar191);
      auVar56._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar183);
      auVar56._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar196);
      auVar56._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar200);
      auVar134 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01ff1d40,auVar56
                         );
      auVar57 = rcpps(auVar56,auVar151);
      fVar183 = auVar57._0_4_;
      auVar152._0_4_ = auVar151._0_4_ * fVar183;
      fVar191 = auVar57._4_4_;
      auVar152._4_4_ = auVar151._4_4_ * fVar191;
      fVar196 = auVar57._8_4_;
      auVar152._8_4_ = auVar151._8_4_ * fVar196;
      fVar200 = auVar57._12_4_;
      auVar152._12_4_ = auVar151._12_4_ * fVar200;
      fVar184 = (float)DAT_01feca10;
      fVar192 = DAT_01feca10._4_4_;
      fVar201 = DAT_01feca10._12_4_;
      fVar78 = DAT_01feca10._8_4_;
      tray.rdir.field_0._0_4_ = (fVar184 - auVar152._0_4_) * fVar183 + fVar183;
      tray.rdir.field_0._4_4_ = (fVar192 - auVar152._4_4_) * fVar191 + fVar191;
      tray.rdir.field_0._8_4_ = (fVar78 - auVar152._8_4_) * fVar196 + fVar196;
      tray.rdir.field_0._12_4_ = (fVar201 - auVar152._12_4_) * fVar200 + fVar200;
      auVar57 = rcpps(auVar152,auVar79);
      fVar183 = auVar57._0_4_;
      fVar191 = auVar57._4_4_;
      fVar196 = auVar57._8_4_;
      fVar200 = auVar57._12_4_;
      tray.rdir.field_0._16_4_ = (fVar184 - auVar79._0_4_ * fVar183) * fVar183 + fVar183;
      tray.rdir.field_0._20_4_ = (fVar192 - auVar79._4_4_ * fVar191) * fVar191 + fVar191;
      tray.rdir.field_0._24_4_ = (fVar78 - auVar79._8_4_ * fVar196) * fVar196 + fVar196;
      tray.rdir.field_0._28_4_ = (fVar201 - auVar79._12_4_ * fVar200) * fVar200 + fVar200;
      auVar57 = rcpps(auVar57,auVar134);
      fVar183 = auVar57._0_4_;
      fVar191 = auVar57._4_4_;
      fVar196 = auVar57._8_4_;
      fVar200 = auVar57._12_4_;
      tray.rdir.field_0._32_4_ = (fVar184 - auVar134._0_4_ * fVar183) * fVar183 + fVar183;
      tray.rdir.field_0._36_4_ = (fVar192 - auVar134._4_4_ * fVar191) * fVar191 + fVar191;
      tray.rdir.field_0._40_4_ = (fVar78 - auVar134._8_4_ * fVar196) * fVar196 + fVar196;
      tray.rdir.field_0._44_4_ = (fVar201 - auVar134._12_4_ * fVar200) * fVar200 + fVar200;
      tray.nearXYZ.field_0._0_8_ =
           CONCAT44(-(uint)((float)tray.rdir.field_0._4_4_ < 0.0),
                    -(uint)((float)tray.rdir.field_0._0_4_ < 0.0)) & 0x1000000010;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar134._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar134._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar134._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar134._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fed0,_DAT_01ffd210,auVar134);
      auVar151._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar151._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar151._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar151._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_0201fef0,_DAT_0201fee0,auVar151);
      auVar57 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar154);
      fVar183 = (float)DAT_01feb9f0;
      fVar191 = DAT_01feb9f0._4_4_;
      fVar196 = DAT_01feb9f0._8_4_;
      fVar200 = DAT_01feb9f0._12_4_;
      auVar58._8_4_ = auVar170._8_4_;
      auVar58._0_8_ = auVar170._0_8_;
      auVar58._12_4_ = auVar170._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feb9f0,auVar57,auVar58);
      auVar108 = maxps(auVar108,auVar154);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01feba00,auVar108,auVar58);
      terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar95 ^ auVar170);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pNVar52 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      iVar24 = 0x224ff80;
      local_1b18 = This;
      paVar45 = &stack_near[2].field_0;
      do {
        paVar46 = paVar45 + -1;
        root.ptr = pNVar52[-1].ptr;
        pNVar52 = pNVar52 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_0025630d:
          iVar24 = 3;
        }
        else {
          local_1c38 = paVar46->v[0];
          fStack_1c34 = *(float *)((long)paVar45 + -0xc);
          fStack_1c30 = *(float *)((long)paVar45 + -8);
          fStack_1c2c = *(float *)((long)paVar45 + -4);
          auVar108 = *(undefined1 (*) [16])paVar46->v;
          auVar59._4_4_ = -(uint)(fStack_1c34 < tray.tfar.field_0.v[1]);
          auVar59._0_4_ = -(uint)(local_1c38 < tray.tfar.field_0.v[0]);
          auVar59._8_4_ = -(uint)(fStack_1c30 < tray.tfar.field_0.v[2]);
          auVar59._12_4_ = -(uint)(fStack_1c2c < tray.tfar.field_0.v[3]);
          uVar25 = movmskps(iVar24,auVar59);
          if (uVar25 == 0) {
LAB_0025631e:
            iVar24 = 2;
          }
          else {
            uVar27 = (ulong)(uVar25 & 0xff);
            uVar25 = POPCOUNT(uVar25 & 0xff);
            iVar24 = 0;
            if (uVar25 <= uVar32) {
              do {
                sVar35 = 0;
                if (uVar27 != 0) {
                  for (; (uVar27 >> sVar35 & 1) == 0; sVar35 = sVar35 + 1) {
                  }
                }
                tray_00 = &tray;
                valid_i = (vint<4> *)local_1b18;
                bVar54 = occluded1(local_1b18,bvh,root,sVar35,&pre,ray,tray_00,context);
                if (bVar54) {
                  terminated.field_0.i[sVar35] = -1;
                }
                uVar27 = uVar27 & uVar27 - 1;
              } while (uVar27 != 0);
              iVar89 = movmskps((int)tray_00,(undefined1  [16])terminated.field_0);
              iVar24 = 3;
              fVar183 = INFINITY;
              fVar191 = INFINITY;
              fVar196 = INFINITY;
              fVar200 = INFINITY;
              local_1c38 = auVar108._0_4_;
              fStack_1c34 = auVar108._4_4_;
              fStack_1c30 = auVar108._8_4_;
              fStack_1c2c = auVar108._12_4_;
              if (iVar89 != 0xf) {
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,(undefined1  [16])_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar24 = 2;
              }
            }
            if (uVar32 < uVar25) {
LAB_002548b7:
              if ((root.ptr & 8) == 0) goto code_r0x002548c1;
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0025630d;
              auVar62._4_4_ = -(uint)(fStack_1c34 < tray.tfar.field_0.v[1]);
              auVar62._0_4_ = -(uint)(local_1c38 < tray.tfar.field_0.v[0]);
              auVar62._8_4_ = -(uint)(fStack_1c30 < tray.tfar.field_0.v[2]);
              auVar62._12_4_ = -(uint)(fStack_1c2c < tray.tfar.field_0.v[3]);
              iVar24 = movmskps(iVar24,auVar62);
              if (iVar24 != 0) {
                if (((uint)root.ptr & 0xf) == 8) {
                  fVar78 = (float)(*(int *)(pre.super_Precalculations.grid + 8) - 1U);
                  auVar188._0_4_ = fVar78 * *(float *)(ray + 0x70);
                  auVar188._4_4_ = fVar78 * *(float *)(ray + 0x74);
                  auVar188._8_4_ = fVar78 * *(float *)(ray + 0x78);
                  auVar188._12_4_ = fVar78 * *(float *)(ray + 0x7c);
                  auVar108 = roundps(auVar62,auVar188,1);
                  auVar80._0_4_ = fVar78 + -1.0;
                  auVar80._4_4_ = auVar80._0_4_;
                  auVar80._8_4_ = auVar80._0_4_;
                  auVar80._12_4_ = auVar80._0_4_;
                  auVar108 = minps(auVar108,auVar80);
                  auVar108 = maxps(auVar108,_DAT_01feba10);
                  iVar24 = (int)auVar108._0_4_;
                  iVar89 = (int)auVar108._4_4_;
                  iVar90 = (int)auVar108._8_4_;
                  iVar91 = (int)auVar108._12_4_;
                  vitime.field_0.i[0] = iVar24;
                  vitime.field_0.i[1] = iVar89;
                  vitime.field_0.i[2] = iVar90;
                  vitime.field_0.i[3] = iVar91;
                  uVar25 = movmskps(*(int *)(pre.super_Precalculations.grid + 8) - 1U,
                                    (undefined1  [16])terminated.field_0);
                  pGVar28 = (GridSOA *)(ulong)(uVar25 ^ 0xf);
                  if ((uVar25 ^ 0xf) == 0) {
                    local_1b88 = terminated.field_0;
                  }
                  else {
                    fVar140 = auVar188._0_4_ - auVar108._0_4_;
                    fVar121 = auVar188._4_4_ - auVar108._4_4_;
                    fVar131 = auVar188._8_4_ - auVar108._8_4_;
                    fVar133 = auVar188._12_4_ - auVar108._12_4_;
                    local_1b88._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                    local_1b88.i[2] = terminated.field_0._8_4_ ^ 0xffffffff;
                    local_1b88.i[3] = terminated.field_0._12_4_ ^ 0xffffffff;
                    fVar78 = 1.0 - fVar140;
                    fVar184 = 1.0 - fVar121;
                    fVar192 = 1.0 - fVar131;
                    fVar201 = 1.0 - fVar133;
                    uVar27 = root.ptr >> 2 & 0xfffffffffffffffc;
                    auVar207._8_4_ = local_1b88.i[2];
                    auVar207._0_8_ = local_1b88._0_8_;
                    auVar207._12_4_ = local_1b88.i[3];
                    do {
                      lVar5 = 0;
                      if (((ulong)pGVar28 & 0xf) != 0) {
                        for (; (((uint)pGVar28 & 0xf) >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                        }
                      }
                      iVar26 = vitime.field_0.i[(int)lVar5];
                      uVar38 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                      uVar47 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc);
                      uVar34 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                      lVar43 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x28) *
                               (long)iVar26;
                      uVar48 = (ulong)(*(uint *)(pre.super_Precalculations.grid + 0x28) & 0xfffffffc
                                      );
                      lVar37 = uVar48 + uVar34 + lVar43;
                      lVar40 = uVar38 * 0xc + lVar37;
                      local_1b10 = pre.super_Precalculations.grid + lVar40 + uVar47 * 4 + uVar27;
                      lVar42 = lVar43 + uVar38 * 8 + uVar34;
                      lVar49 = uVar48 + lVar42;
                      local_1ae8 = pre.super_Precalculations.grid + lVar49 + uVar47 * 4 + uVar27;
                      lVar5 = lVar37 + uVar38 * 4;
                      local_1af0 = pre.super_Precalculations.grid + lVar5 + uVar47 * 4 + uVar27;
                      local_1af8 = pre.super_Precalculations.grid + lVar37 + uVar47 * 4 + uVar27;
                      lVar51 = uVar27 + 0x30;
                      local_1b00 = pre.super_Precalculations.grid +
                                   uVar34 + lVar43 + uVar47 * 4 + lVar51;
                      pGVar28 = pre.super_Precalculations.grid + lVar42 + uVar47 * 4 + lVar51;
                      lVar44 = lVar43 + uVar38 * 4 + uVar34;
                      pGVar50 = pre.super_Precalculations.grid + lVar44 + uVar47 * 4 + lVar51;
                      local_1be0 = pre.super_Precalculations.grid + lVar40 + lVar51;
                      pGVar39 = pre.super_Precalculations.grid + lVar49 + lVar51;
                      local_1b08 = pre.super_Precalculations.grid + lVar5 + lVar51;
                      local_1a30 = pre.super_Precalculations.grid + lVar37 + lVar51;
                      local_1a38 = pre.super_Precalculations.grid + lVar42 + lVar51;
                      local_1a40 = pre.super_Precalculations.grid + lVar44 + lVar51;
                      auVar63._0_4_ = -(uint)(iVar26 == iVar24);
                      auVar63._4_4_ = -(uint)(iVar26 == iVar89);
                      auVar63._8_4_ = -(uint)(iVar26 == iVar90);
                      auVar63._12_4_ = -(uint)(iVar26 == iVar91);
                      auVar63 = auVar63 & auVar207;
                      auVar95 = auVar63 ^ _DAT_01febe20;
                      pGVar41 = pre.super_Precalculations.grid + lVar43;
                      local_1adc = *(int *)(pre.super_Precalculations.grid + 0x10);
                      lVar5 = uVar47 * 4;
                      valid_i = (vint<4> *)(uVar34 + 0x2c);
                      local_1a48 = (GridSOA *)0x0;
                      auVar108 = auVar207;
                      local_1c28 = auVar63;
                      local_1ad8 = auVar207;
                      do {
                        pGVar29 = pGVar41 + uVar27 + (long)valid_i;
                        lVar51 = 0;
                        pGVar30 = pGVar29;
                        do {
                          if ((ulong)(uVar47 != 2) * 4 + 4 == lVar51) break;
                          fVar183 = *(float *)(pGVar29 + lVar51);
                          fVar191 = *(float *)(pGVar29 + lVar51 + 4);
                          fVar196 = *(float *)(local_1a40 + lVar51 + -4);
                          fVar200 = *(float *)(local_1a40 + lVar51);
                          fVar146 = *(float *)(local_1a38 + lVar51 + -4);
                          fVar147 = *(float *)(local_1a38 + lVar51);
                          fVar148 = *(float *)(local_1b00 + lVar51 + -4);
                          fVar93 = *(float *)(pGVar50 + lVar51 + -4);
                          fVar55 = *(float *)(pGVar28 + lVar51 + -4);
                          fVar76 = *(float *)(local_1a30 + lVar51 + -4);
                          fVar77 = *(float *)(local_1a30 + lVar51);
                          fVar92 = *(float *)(local_1b08 + lVar51 + -4);
                          fVar105 = *(float *)(local_1b08 + lVar51);
                          fVar106 = *(float *)(pGVar39 + lVar51 + -4);
                          fVar107 = *(float *)(pGVar39 + lVar51);
                          fVar113 = *(float *)(local_1af8 + lVar51 + 0x2c);
                          fVar116 = *(float *)(local_1af0 + lVar51 + 0x2c);
                          fVar127 = *(float *)(local_1ae8 + lVar51 + 0x2c);
                          fVar217 = fVar191 * fVar78 + fVar77 * fVar140;
                          fVar220 = fVar191 * fVar184 + fVar77 * fVar121;
                          fVar222 = fVar191 * fVar192 + fVar77 * fVar131;
                          fVar224 = fVar191 * fVar201 + fVar77 * fVar133;
                          fVar149 = fVar200 * fVar78 + fVar105 * fVar140;
                          fVar160 = fVar200 * fVar184 + fVar105 * fVar121;
                          fVar162 = fVar200 * fVar192 + fVar105 * fVar131;
                          fVar164 = fVar200 * fVar201 + fVar105 * fVar133;
                          local_1a98 = fVar147 * fVar78 + fVar107 * fVar140;
                          fStack_1a94 = fVar147 * fVar184 + fVar107 * fVar121;
                          fStack_1a90 = fVar147 * fVar192 + fVar107 * fVar131;
                          fStack_1a8c = fVar147 * fVar201 + fVar107 * fVar133;
                          fVar205 = fVar148 * fVar78 + fVar113 * fVar140;
                          fVar210 = fVar148 * fVar184 + fVar113 * fVar121;
                          fVar212 = fVar148 * fVar192 + fVar113 * fVar131;
                          fVar215 = fVar148 * fVar201 + fVar113 * fVar133;
                          fVar226 = fVar93 * fVar78 + fVar116 * fVar140;
                          fVar228 = fVar93 * fVar184 + fVar116 * fVar121;
                          fVar230 = fVar93 * fVar192 + fVar116 * fVar131;
                          fVar232 = fVar93 * fVar201 + fVar116 * fVar133;
                          fVar238 = fVar55 * fVar78 + fVar127 * fVar140;
                          fVar240 = fVar55 * fVar184 + fVar127 * fVar121;
                          fVar242 = fVar55 * fVar192 + fVar127 * fVar131;
                          fVar244 = fVar55 * fVar201 + fVar127 * fVar133;
                          fVar191 = *(float *)ray;
                          fVar200 = *(float *)(ray + 4);
                          fVar147 = *(float *)(ray + 8);
                          fVar148 = *(float *)(ray + 0xc);
                          fVar93 = *(float *)(ray + 0x10);
                          fVar55 = *(float *)(ray + 0x14);
                          fVar77 = *(float *)(ray + 0x18);
                          fVar105 = *(float *)(ray + 0x1c);
                          fVar107 = *(float *)(ray + 0x20);
                          fVar113 = *(float *)(ray + 0x24);
                          fVar116 = *(float *)(ray + 0x28);
                          fVar127 = *(float *)(ray + 0x2c);
                          fVar186 = (fVar183 * fVar78 + fVar76 * fVar140) - fVar191;
                          fVar194 = (fVar183 * fVar184 + fVar76 * fVar121) - fVar200;
                          fVar198 = (fVar183 * fVar192 + fVar76 * fVar131) - fVar147;
                          fVar203 = (fVar183 * fVar201 + fVar76 * fVar133) - fVar148;
                          fVar246 = (fVar196 * fVar78 + fVar92 * fVar140) - fVar93;
                          fVar248 = (fVar196 * fVar184 + fVar92 * fVar121) - fVar55;
                          fVar250 = (fVar196 * fVar192 + fVar92 * fVar131) - fVar77;
                          fVar252 = (fVar196 * fVar201 + fVar92 * fVar133) - fVar105;
                          local_1ab8._0_4_ = (fVar146 * fVar78 + fVar106 * fVar140) - fVar107;
                          local_1ab8._4_4_ = (fVar146 * fVar184 + fVar106 * fVar121) - fVar113;
                          fStack_1ab0 = (fVar146 * fVar192 + fVar106 * fVar131) - fVar116;
                          fStack_1aac = (fVar146 * fVar201 + fVar106 * fVar133) - fVar127;
                          fVar122 = fVar217 - fVar191;
                          fVar128 = fVar220 - fVar200;
                          fVar130 = fVar222 - fVar147;
                          fVar132 = fVar224 - fVar148;
                          fVar150 = fVar149 - fVar93;
                          fVar161 = fVar160 - fVar55;
                          fVar163 = fVar162 - fVar77;
                          fVar165 = fVar164 - fVar105;
                          fVar168 = local_1a98 - fVar107;
                          fVar175 = fStack_1a94 - fVar113;
                          fVar178 = fStack_1a90 - fVar116;
                          fVar181 = fStack_1a8c - fVar127;
                          fVar191 = fVar205 - fVar191;
                          fVar200 = fVar210 - fVar200;
                          fVar147 = fVar212 - fVar147;
                          fVar148 = fVar215 - fVar148;
                          fVar93 = fVar226 - fVar93;
                          fVar55 = fVar228 - fVar55;
                          fVar77 = fVar230 - fVar77;
                          fVar105 = fVar232 - fVar105;
                          fVar107 = fVar238 - fVar107;
                          fVar113 = fVar240 - fVar113;
                          fVar116 = fVar242 - fVar116;
                          fVar127 = fVar244 - fVar127;
                          fVar209 = fVar191 - fVar186;
                          fVar114 = fVar200 - fVar194;
                          fVar117 = fVar147 - fVar198;
                          fVar119 = fVar148 - fVar203;
                          fVar239 = fVar93 - fVar246;
                          fVar241 = fVar55 - fVar248;
                          fVar243 = fVar77 - fVar250;
                          fVar245 = fVar105 - fVar252;
                          local_1ac8._0_4_ = fVar107 - (float)local_1ab8._0_4_;
                          local_1ac8._4_4_ = fVar113 - (float)local_1ab8._4_4_;
                          fStack_1ac0 = fVar116 - fStack_1ab0;
                          fStack_1abc = fVar127 - fStack_1aac;
                          pRVar1 = ray + 0x60;
                          auVar22 = *(undefined1 (*) [12])pRVar1;
                          fVar183 = *(float *)(ray + 0x6c);
                          fVar196 = *(float *)(ray + 0x50);
                          fVar146 = *(float *)(ray + 0x54);
                          fVar76 = *(float *)(ray + 0x58);
                          auVar23 = *(undefined1 (*) [12])(ray + 0x50);
                          fVar92 = *(float *)(ray + 0x5c);
                          fVar106 = *(float *)(ray + 0x40);
                          fVar129 = *(float *)(ray + 0x44);
                          fVar138 = *(float *)(ray + 0x48);
                          fVar139 = *(float *)(ray + 0x4c);
                          fVar227 = (fVar239 * (fVar107 + (float)local_1ab8._0_4_) -
                                    (fVar93 + fVar246) * (float)local_1ac8._0_4_) * fVar106 +
                                    ((fVar191 + fVar186) * (float)local_1ac8._0_4_ -
                                    (fVar107 + (float)local_1ab8._0_4_) * fVar209) * fVar196 +
                                    (fVar209 * (fVar93 + fVar246) - (fVar191 + fVar186) * fVar239) *
                                    *(float *)pRVar1;
                          fVar229 = (fVar241 * (fVar113 + (float)local_1ab8._4_4_) -
                                    (fVar55 + fVar248) * (float)local_1ac8._4_4_) * fVar129 +
                                    ((fVar200 + fVar194) * (float)local_1ac8._4_4_ -
                                    (fVar113 + (float)local_1ab8._4_4_) * fVar114) * fVar146 +
                                    (fVar114 * (fVar55 + fVar248) - (fVar200 + fVar194) * fVar241) *
                                    *(float *)(ray + 100);
                          fVar231 = (fVar243 * (fVar116 + fStack_1ab0) -
                                    (fVar77 + fVar250) * fStack_1ac0) * fVar138 +
                                    ((fVar147 + fVar198) * fStack_1ac0 -
                                    (fVar116 + fStack_1ab0) * fVar117) * fVar76 +
                                    (fVar117 * (fVar77 + fVar250) - (fVar147 + fVar198) * fVar243) *
                                    *(float *)(ray + 0x68);
                          fVar233 = (fVar245 * (fVar127 + fStack_1aac) -
                                    (fVar105 + fVar252) * fStack_1abc) * fVar139 +
                                    ((fVar148 + fVar203) * fStack_1abc -
                                    (fVar127 + fStack_1aac) * fVar119) * fVar92 +
                                    (fVar119 * (fVar105 + fVar252) - (fVar148 + fVar203) * fVar245)
                                    * fVar183;
                          fVar214 = fVar186 - fVar122;
                          fVar115 = fVar194 - fVar128;
                          fVar118 = fVar198 - fVar130;
                          fVar120 = fVar203 - fVar132;
                          fVar187 = fVar246 - fVar150;
                          fVar195 = fVar248 - fVar161;
                          fVar199 = fVar250 - fVar163;
                          fVar204 = fVar252 - fVar165;
                          fVar218 = (float)local_1ab8._0_4_ - fVar168;
                          fVar221 = (float)local_1ab8._4_4_ - fVar175;
                          fVar223 = fStack_1ab0 - fVar178;
                          fVar225 = fStack_1aac - fVar181;
                          local_1aa8._0_4_ = auVar22._0_4_;
                          local_1aa8._4_4_ = auVar22._4_4_;
                          fStack_1aa0 = auVar22._8_4_;
                          fVar234 = (fVar187 * ((float)local_1ab8._0_4_ + fVar168) -
                                    (fVar246 + fVar150) * fVar218) * fVar106 +
                                    ((fVar186 + fVar122) * fVar218 -
                                    ((float)local_1ab8._0_4_ + fVar168) * fVar214) * fVar196 +
                                    (fVar214 * (fVar246 + fVar150) - (fVar186 + fVar122) * fVar187)
                                    * (float)local_1aa8._0_4_;
                          fVar235 = (fVar195 * ((float)local_1ab8._4_4_ + fVar175) -
                                    (fVar248 + fVar161) * fVar221) * fVar129 +
                                    ((fVar194 + fVar128) * fVar221 -
                                    ((float)local_1ab8._4_4_ + fVar175) * fVar115) * fVar146 +
                                    (fVar115 * (fVar248 + fVar161) - (fVar194 + fVar128) * fVar195)
                                    * (float)local_1aa8._4_4_;
                          fVar236 = (fVar199 * (fStack_1ab0 + fVar178) -
                                    (fVar250 + fVar163) * fVar223) * fVar138 +
                                    ((fVar198 + fVar130) * fVar223 -
                                    (fStack_1ab0 + fVar178) * fVar118) * fVar76 +
                                    (fVar118 * (fVar250 + fVar163) - (fVar198 + fVar130) * fVar199)
                                    * fStack_1aa0;
                          fVar237 = (fVar204 * (fStack_1aac + fVar181) -
                                    (fVar252 + fVar165) * fVar225) * fVar139 +
                                    ((fVar203 + fVar132) * fVar225 -
                                    (fStack_1aac + fVar181) * fVar120) * fVar92 +
                                    (fVar120 * (fVar252 + fVar165) - (fVar203 + fVar132) * fVar204)
                                    * fVar183;
                          fVar206 = fVar122 - fVar191;
                          fVar211 = fVar128 - fVar200;
                          fVar213 = fVar130 - fVar147;
                          fVar216 = fVar132 - fVar148;
                          fVar247 = fVar150 - fVar93;
                          fVar249 = fVar161 - fVar55;
                          fVar251 = fVar163 - fVar77;
                          fVar253 = fVar165 - fVar105;
                          fVar169 = fVar168 - fVar107;
                          fVar176 = fVar175 - fVar113;
                          fVar179 = fVar178 - fVar116;
                          fVar182 = fVar181 - fVar127;
                          fVar191 = (fVar247 * (fVar107 + fVar168) - (fVar93 + fVar150) * fVar169) *
                                    fVar106 + ((fVar191 + fVar122) * fVar169 -
                                              (fVar107 + fVar168) * fVar206) * fVar196 +
                                              (fVar206 * (fVar93 + fVar150) -
                                              (fVar191 + fVar122) * fVar247) *
                                              (float)local_1aa8._0_4_;
                          fVar196 = (fVar249 * (fVar113 + fVar175) - (fVar55 + fVar161) * fVar176) *
                                    fVar129 + ((fVar200 + fVar128) * fVar176 -
                                              (fVar113 + fVar175) * fVar211) * fVar146 +
                                              (fVar211 * (fVar55 + fVar161) -
                                              (fVar200 + fVar128) * fVar249) *
                                              (float)local_1aa8._4_4_;
                          fVar200 = (fVar251 * (fVar116 + fVar178) - (fVar77 + fVar163) * fVar179) *
                                    fVar138 + ((fVar147 + fVar130) * fVar179 -
                                              (fVar116 + fVar178) * fVar213) * fVar76 +
                                              (fVar213 * (fVar77 + fVar163) -
                                              (fVar147 + fVar130) * fVar251) * fStack_1aa0;
                          fVar146 = (fVar253 * (fVar127 + fVar181) - (fVar105 + fVar165) * fVar182)
                                    * fVar139 +
                                    ((fVar148 + fVar132) * fVar182 - (fVar127 + fVar181) * fVar216)
                                    * fVar92 +
                                    (fVar216 * (fVar105 + fVar165) - (fVar148 + fVar132) * fVar253)
                                    * fVar183;
                          fVar147 = fVar227 + fVar234 + fVar191;
                          fVar148 = fVar229 + fVar235 + fVar196;
                          fVar93 = fVar231 + fVar236 + fVar200;
                          fVar55 = fVar233 + fVar237 + fVar146;
                          auVar64._4_4_ = fVar229;
                          auVar64._0_4_ = fVar227;
                          auVar64._8_4_ = fVar231;
                          auVar64._12_4_ = fVar233;
                          auVar13._4_4_ = fVar235;
                          auVar13._0_4_ = fVar234;
                          auVar13._8_4_ = fVar236;
                          auVar13._12_4_ = fVar237;
                          auVar108 = minps(auVar64,auVar13);
                          auVar16._4_4_ = fVar196;
                          auVar16._0_4_ = fVar191;
                          auVar16._8_4_ = fVar200;
                          auVar16._12_4_ = fVar146;
                          auVar108 = minps(auVar108,auVar16);
                          auVar153._4_4_ = fVar229;
                          auVar153._0_4_ = fVar227;
                          auVar153._8_4_ = fVar231;
                          auVar153._12_4_ = fVar233;
                          auVar14._4_4_ = fVar235;
                          auVar14._0_4_ = fVar234;
                          auVar14._8_4_ = fVar236;
                          auVar14._12_4_ = fVar237;
                          auVar154 = maxps(auVar153,auVar14);
                          auVar17._4_4_ = fVar196;
                          auVar17._0_4_ = fVar191;
                          auVar17._8_4_ = fVar200;
                          auVar17._12_4_ = fVar146;
                          auVar154 = maxps(auVar154,auVar17);
                          fVar191 = ABS(fVar147) * 1.1920929e-07;
                          fVar196 = ABS(fVar148) * 1.1920929e-07;
                          fVar200 = ABS(fVar93) * 1.1920929e-07;
                          fVar146 = ABS(fVar55) * 1.1920929e-07;
                          auVar155._0_8_ =
                               CONCAT44(-(uint)(auVar154._4_4_ <= fVar196 ||
                                               -fVar196 <= auVar108._4_4_) & local_1c28._4_4_,
                                        -(uint)(auVar154._0_4_ <= fVar191 ||
                                               -fVar191 <= auVar108._0_4_) & local_1c28._0_4_);
                          auVar155._8_4_ =
                               -(uint)(auVar154._8_4_ <= fVar200 || -fVar200 <= auVar108._8_4_) &
                               local_1c28._8_4_;
                          auVar155._12_4_ =
                               -(uint)(auVar154._12_4_ <= fVar146 || -fVar146 <= auVar108._12_4_) &
                               local_1c28._12_4_;
                          iVar26 = movmskps((int)local_1ae8,auVar155);
                          if (iVar26 == 0) {
                            auVar143._8_4_ = auVar155._8_4_;
                            auVar143._0_8_ = auVar155._0_8_;
                            auVar143._12_4_ = auVar155._12_4_;
                          }
                          else {
                            auVar135._0_4_ = fVar239 * fVar218 - fVar187 * (float)local_1ac8._0_4_;
                            auVar135._4_4_ = fVar241 * fVar221 - fVar195 * (float)local_1ac8._4_4_;
                            auVar135._8_4_ = fVar243 * fVar223 - fVar199 * fStack_1ac0;
                            auVar135._12_4_ = fVar245 * fVar225 - fVar204 * fStack_1abc;
                            auVar189._0_4_ = fVar187 * fVar169 - fVar247 * fVar218;
                            auVar189._4_4_ = fVar195 * fVar176 - fVar249 * fVar221;
                            auVar189._8_4_ = fVar199 * fVar179 - fVar251 * fVar223;
                            auVar189._12_4_ = fVar204 * fVar182 - fVar253 * fVar225;
                            auVar65._4_4_ =
                                 -(uint)(ABS(fVar195 * (float)local_1ac8._4_4_) <
                                        ABS(fVar249 * fVar221));
                            auVar65._0_4_ =
                                 -(uint)(ABS(fVar187 * (float)local_1ac8._0_4_) <
                                        ABS(fVar247 * fVar218));
                            auVar65._8_4_ =
                                 -(uint)(ABS(fVar199 * fStack_1ac0) < ABS(fVar251 * fVar223));
                            auVar65._12_4_ =
                                 -(uint)(ABS(fVar204 * fStack_1abc) < ABS(fVar253 * fVar225));
                            auVar57 = blendvps(auVar189,auVar135,auVar65);
                            auVar171._0_4_ = (float)local_1ac8._0_4_ * fVar214 - fVar209 * fVar218;
                            auVar171._4_4_ = (float)local_1ac8._4_4_ * fVar115 - fVar114 * fVar221;
                            auVar171._8_4_ = fStack_1ac0 * fVar118 - fVar117 * fVar223;
                            auVar171._12_4_ = fStack_1abc * fVar120 - fVar119 * fVar225;
                            auVar208._0_4_ = fVar206 * fVar218 - fVar214 * fVar169;
                            auVar208._4_4_ = fVar211 * fVar221 - fVar115 * fVar176;
                            auVar208._8_4_ = fVar213 * fVar223 - fVar118 * fVar179;
                            auVar208._12_4_ = fVar216 * fVar225 - fVar120 * fVar182;
                            auVar66._4_4_ = -(uint)(ABS(fVar114 * fVar221) < ABS(fVar115 * fVar176))
                            ;
                            auVar66._0_4_ = -(uint)(ABS(fVar209 * fVar218) < ABS(fVar214 * fVar169))
                            ;
                            auVar66._8_4_ = -(uint)(ABS(fVar117 * fVar223) < ABS(fVar118 * fVar179))
                            ;
                            auVar66._12_4_ =
                                 -(uint)(ABS(fVar119 * fVar225) < ABS(fVar120 * fVar182));
                            auVar79 = blendvps(auVar208,auVar171,auVar66);
                            auVar109._0_4_ = fVar214 * fVar247 - fVar206 * fVar187;
                            auVar109._4_4_ = fVar115 * fVar249 - fVar211 * fVar195;
                            auVar109._8_4_ = fVar118 * fVar251 - fVar213 * fVar199;
                            auVar109._12_4_ = fVar120 * fVar253 - fVar216 * fVar204;
                            auVar67._4_4_ = -(uint)(ABS(fVar115 * fVar241) < ABS(fVar211 * fVar195))
                            ;
                            auVar67._0_4_ = -(uint)(ABS(fVar214 * fVar239) < ABS(fVar206 * fVar187))
                            ;
                            auVar67._8_4_ = -(uint)(ABS(fVar118 * fVar243) < ABS(fVar213 * fVar199))
                            ;
                            auVar67._12_4_ =
                                 -(uint)(ABS(fVar120 * fVar245) < ABS(fVar216 * fVar204));
                            auVar12._4_4_ = fVar114 * fVar195 - fVar115 * fVar241;
                            auVar12._0_4_ = fVar209 * fVar187 - fVar214 * fVar239;
                            auVar12._8_4_ = fVar117 * fVar199 - fVar118 * fVar243;
                            auVar12._12_4_ = fVar119 * fVar204 - fVar120 * fVar245;
                            auVar154 = blendvps(auVar109,auVar12,auVar67);
                            local_1bd8 = auVar23._0_4_;
                            fStack_1bd4 = auVar23._4_4_;
                            fStack_1bd0 = auVar23._8_4_;
                            fVar191 = fVar106 * auVar57._0_4_ +
                                      local_1bd8 * auVar79._0_4_ +
                                      (float)local_1aa8._0_4_ * auVar154._0_4_;
                            fVar196 = fVar129 * auVar57._4_4_ +
                                      fStack_1bd4 * auVar79._4_4_ +
                                      (float)local_1aa8._4_4_ * auVar154._4_4_;
                            fVar200 = fVar138 * auVar57._8_4_ +
                                      fStack_1bd0 * auVar79._8_4_ + fStack_1aa0 * auVar154._8_4_;
                            fVar183 = fVar139 * auVar57._12_4_ +
                                      fVar92 * auVar79._12_4_ + fVar183 * auVar154._12_4_;
                            auVar141._0_4_ = fVar191 + fVar191;
                            auVar141._4_4_ = fVar196 + fVar196;
                            auVar141._8_4_ = fVar200 + fVar200;
                            auVar141._12_4_ = fVar183 + fVar183;
                            auVar81._0_4_ = (float)local_1ab8._0_4_ * auVar154._0_4_;
                            auVar81._4_4_ = (float)local_1ab8._4_4_ * auVar154._4_4_;
                            auVar81._8_4_ = fStack_1ab0 * auVar154._8_4_;
                            auVar81._12_4_ = fStack_1aac * auVar154._12_4_;
                            fVar146 = fVar186 * auVar57._0_4_ +
                                      fVar246 * auVar79._0_4_ + auVar81._0_4_;
                            fVar76 = fVar194 * auVar57._4_4_ +
                                     fVar248 * auVar79._4_4_ + auVar81._4_4_;
                            fVar77 = fVar198 * auVar57._8_4_ +
                                     fVar250 * auVar79._8_4_ + auVar81._8_4_;
                            fVar92 = fVar203 * auVar57._12_4_ +
                                     fVar252 * auVar79._12_4_ + auVar81._12_4_;
                            auVar108 = rcpps(auVar81,auVar141);
                            fVar183 = auVar108._0_4_;
                            fVar191 = auVar108._4_4_;
                            fVar196 = auVar108._8_4_;
                            fVar200 = auVar108._12_4_;
                            fVar183 = ((1.0 - auVar141._0_4_ * fVar183) * fVar183 + fVar183) *
                                      (fVar146 + fVar146);
                            fVar191 = ((1.0 - auVar141._4_4_ * fVar191) * fVar191 + fVar191) *
                                      (fVar76 + fVar76);
                            fVar196 = ((1.0 - auVar141._8_4_ * fVar196) * fVar196 + fVar196) *
                                      (fVar77 + fVar77);
                            fVar200 = ((1.0 - auVar141._12_4_ * fVar200) * fVar200 + fVar200) *
                                      (fVar92 + fVar92);
                            auVar142._0_4_ =
                                 (int)((uint)((fVar183 <= *(float *)(ray + 0x80) &&
                                              *(float *)(ray + 0x30) <= fVar183) &&
                                             auVar141._0_4_ != 0.0) * -0x80000000) >> 0x1f;
                            auVar142._4_4_ =
                                 (int)((uint)((fVar191 <= *(float *)(ray + 0x84) &&
                                              *(float *)(ray + 0x34) <= fVar191) &&
                                             auVar141._4_4_ != 0.0) * -0x80000000) >> 0x1f;
                            auVar142._8_4_ =
                                 (int)((uint)((fVar196 <= *(float *)(ray + 0x88) &&
                                              *(float *)(ray + 0x38) <= fVar196) &&
                                             auVar141._8_4_ != 0.0) * -0x80000000) >> 0x1f;
                            auVar142._12_4_ =
                                 (int)((uint)((fVar200 <= *(float *)(ray + 0x8c) &&
                                              *(float *)(ray + 0x3c) <= fVar200) &&
                                             auVar141._12_4_ != 0.0) * -0x80000000) >> 0x1f;
                            auVar143 = auVar142 & auVar155;
                            iVar26 = movmskps(iVar26,auVar143);
                            if (iVar26 != 0) {
                              local_1718 = CONCAT44(fVar229,fVar227);
                              uStack_1710 = CONCAT44(fVar233,fVar231);
                              local_1728 = CONCAT44(fVar235,fVar234);
                              uStack_1720 = CONCAT44(fVar237,fVar236);
                              local_1738 = CONCAT44(fVar148,fVar147);
                              uStack_1730 = CONCAT44(fVar55,fVar93);
                              local_1778 = auVar154;
                              local_1768 = auVar79;
                              local_1758 = auVar57;
                              local_1748 = fVar183;
                              fStack_1744 = fVar191;
                              fStack_1740 = fVar196;
                              fStack_173c = fVar200;
                            }
                          }
                          auVar159._4_4_ = fVar210;
                          auVar159._0_4_ = fVar205;
                          auVar159._8_4_ = fVar212;
                          auVar159._12_4_ = fVar215;
                          auVar137._4_4_ = fVar228;
                          auVar137._0_4_ = fVar226;
                          auVar137._8_4_ = fVar230;
                          auVar137._12_4_ = fVar232;
                          fVar183 = *(float *)(local_1b00 + lVar51);
                          fVar147 = *(float *)(pGVar50 + lVar51);
                          _local_1aa8 = ZEXT416((uint)fVar147);
                          fVar191 = *(float *)(pGVar28 + lVar51);
                          fVar196 = *(float *)(local_1af8 + lVar51 + 0x30);
                          fVar200 = *(float *)(local_1af0 + lVar51 + 0x30);
                          fVar146 = *(float *)(local_1ae8 + lVar51 + 0x30);
                          uVar25 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                          pRVar2 = (context->scene->geometries).items;
                          pGVar3 = pRVar2[uVar25].ptr;
                          uVar167 = pGVar3->mask;
                          auVar82._0_4_ = -(uint)((uVar167 & *(uint *)(ray + 0x90)) == 0);
                          auVar82._4_4_ = -(uint)((uVar167 & *(uint *)(ray + 0x94)) == 0);
                          auVar82._8_4_ = -(uint)((uVar167 & *(uint *)(ray + 0x98)) == 0);
                          auVar82._12_4_ = -(uint)((uVar167 & *(uint *)(ray + 0x9c)) == 0);
                          auVar83 = ~auVar82 & auVar143;
                          iVar26 = movmskps((int)pRVar2,auVar83);
                          auVar108 = *(undefined1 (*) [16])pRVar1;
                          if (iVar26 != 0) {
                            uVar33 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (auVar108 = _local_1aa8, auVar154 = *(undefined1 (*) [16])pRVar1,
                               pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar21._8_8_ = uStack_1730;
                              auVar21._0_8_ = local_1738;
                              fVar76 = (float)((ulong)local_1738 >> 0x20);
                              fVar77 = (float)((ulong)uStack_1730 >> 0x20);
                              auVar108 = rcpps(ZEXT416(uVar167),auVar21);
                              fVar147 = auVar108._0_4_;
                              fVar148 = auVar108._4_4_;
                              fVar93 = auVar108._8_4_;
                              fVar55 = auVar108._12_4_;
                              fVar147 = (float)(-(uint)(1e-18 <= ABS((float)local_1738)) &
                                               (uint)(((float)DAT_01feca10 -
                                                      (float)local_1738 * fVar147) * fVar147 +
                                                     fVar147));
                              fVar148 = (float)(-(uint)(1e-18 <= ABS(fVar76)) &
                                               (uint)((DAT_01feca10._4_4_ - fVar76 * fVar148) *
                                                      fVar148 + fVar148));
                              fVar93 = (float)(-(uint)(1e-18 <= ABS((float)uStack_1730)) &
                                              (uint)((DAT_01feca10._8_4_ -
                                                     (float)uStack_1730 * fVar93) * fVar93 + fVar93)
                                              );
                              fVar55 = (float)(-(uint)(1e-18 <= ABS(fVar77)) &
                                              (uint)((DAT_01feca10._12_4_ - fVar77 * fVar55) *
                                                     fVar55 + fVar55));
                              auVar72._0_4_ = (float)local_1718 * fVar147;
                              auVar72._4_4_ = local_1718._4_4_ * fVar148;
                              auVar72._8_4_ = (float)uStack_1710 * fVar93;
                              auVar72._12_4_ = uStack_1710._4_4_ * fVar55;
                              auVar108 = minps(auVar72,_DAT_01feca10);
                              auVar97._0_4_ = fVar147 * (float)local_1728;
                              auVar97._4_4_ = fVar148 * local_1728._4_4_;
                              auVar97._8_4_ = fVar93 * (float)uStack_1720;
                              auVar97._12_4_ = fVar55 * uStack_1720._4_4_;
                              auVar154 = minps(auVar97,_DAT_01feca10);
                              uVar167 = *(uint *)(local_1be0 + lVar51 + -4);
                              auVar125._4_4_ = uVar167;
                              auVar125._0_4_ = uVar167;
                              auVar125._8_4_ = uVar167;
                              auVar125._12_4_ = uVar167;
                              uVar174 = *(uint *)(local_1b10 + lVar51 + 0x2c);
                              auVar111._4_4_ = uVar174;
                              auVar111._0_4_ = uVar174;
                              auVar111._8_4_ = uVar174;
                              auVar111._12_4_ = uVar174;
                              auVar57 = pblendw(auVar125,(undefined1  [16])0x0,0xaa);
                              fVar147 = auVar108._0_4_;
                              fVar148 = auVar108._4_4_;
                              fVar93 = auVar108._8_4_;
                              fVar55 = auVar108._12_4_;
                              fVar76 = auVar154._0_4_;
                              fVar106 = ((float)DAT_01feca10 - fVar147) - fVar76;
                              fVar77 = auVar154._4_4_;
                              fVar107 = (DAT_01feca10._4_4_ - fVar148) - fVar77;
                              fVar92 = auVar154._8_4_;
                              fVar113 = (DAT_01feca10._8_4_ - fVar93) - fVar92;
                              fVar105 = auVar154._12_4_;
                              fVar116 = (DAT_01feca10._12_4_ - fVar55) - fVar105;
                              auVar154 = pblendw(auVar111,(undefined1  [16])0x0,0xaa);
                              uVar177 = *(uint *)(local_1be0 + lVar51);
                              auVar98._4_4_ = uVar177;
                              auVar98._0_4_ = uVar177;
                              auVar98._8_4_ = uVar177;
                              auVar98._12_4_ = uVar177;
                              auVar108 = pblendw(auVar98,(undefined1  [16])0x0,0xaa);
                              local_1998 = local_1758._0_8_;
                              uStack_1990 = local_1758._8_8_;
                              local_1988 = local_1768._0_8_;
                              uStack_1980 = local_1768._8_8_;
                              local_1978 = local_1778;
                              local_1968 = (float)auVar108._0_4_ * 0.00012207031 * fVar147 +
                                           (float)auVar154._0_4_ * 0.00012207031 * fVar76 +
                                           (float)auVar57._0_4_ * 0.00012207031 * fVar106;
                              fStack_1964 = (float)auVar108._4_4_ * 0.00012207031 * fVar148 +
                                            (float)auVar154._4_4_ * 0.00012207031 * fVar77 +
                                            (float)auVar57._4_4_ * 0.00012207031 * fVar107;
                              fStack_1960 = (float)auVar108._8_4_ * 0.00012207031 * fVar93 +
                                            (float)auVar154._8_4_ * 0.00012207031 * fVar92 +
                                            (float)auVar57._8_4_ * 0.00012207031 * fVar113;
                              fStack_195c = (float)auVar108._12_4_ * 0.00012207031 * fVar55 +
                                            (float)auVar154._12_4_ * 0.00012207031 * fVar105 +
                                            (float)auVar57._12_4_ * 0.00012207031 * fVar116;
                              local_1958 = (float)(uVar177 >> 0x10) * 0.00012207031 * fVar147 +
                                           (float)(uVar174 >> 0x10) * 0.00012207031 * fVar76 +
                                           fVar106 * (float)(uVar167 >> 0x10) * 0.00012207031;
                              fStack_1954 = (float)(uVar177 >> 0x10) * 0.00012207031 * fVar148 +
                                            (float)(uVar174 >> 0x10) * 0.00012207031 * fVar77 +
                                            fVar107 * (float)(uVar167 >> 0x10) * 0.00012207031;
                              fStack_1950 = (float)(uVar177 >> 0x10) * 0.00012207031 * fVar93 +
                                            (float)(uVar174 >> 0x10) * 0.00012207031 * fVar92 +
                                            fVar113 * (float)(uVar167 >> 0x10) * 0.00012207031;
                              fStack_194c = (float)(uVar177 >> 0x10) * 0.00012207031 * fVar55 +
                                            (float)(uVar174 >> 0x10) * 0.00012207031 * fVar105 +
                                            fVar116 * (float)(uVar167 >> 0x10) * 0.00012207031;
                              local_1948 = uVar33;
                              uStack_1944 = uVar33;
                              uStack_1940 = uVar33;
                              uStack_193c = uVar33;
                              local_1938 = uVar25;
                              uStack_1934 = uVar25;
                              uStack_1930 = uVar25;
                              uStack_192c = uVar25;
                              local_1928 = context->user->instID[0];
                              uStack_1924 = local_1928;
                              uStack_1920 = local_1928;
                              uStack_191c = local_1928;
                              local_1918 = context->user->instPrimID[0];
                              uStack_1914 = local_1918;
                              uStack_1910 = local_1918;
                              uStack_190c = local_1918;
                              _local_1ac8 = *(undefined1 (*) [16])(ray + 0x80);
                              auVar20._4_4_ = fStack_1744;
                              auVar20._0_4_ = local_1748;
                              auVar20._8_4_ = fStack_1740;
                              auVar20._12_4_ = fStack_173c;
                              auVar108 = blendvps(_local_1ac8,auVar20,auVar83);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar108;
                              args.valid = (int *)local_1b28;
                              args.geometryUserPtr = pGVar3->userPtr;
                              args.context = context->user;
                              args.hit = (RTCHitN *)&local_1998;
                              args.N = 4;
                              pRVar31 = (RTCRayN *)pGVar3->occlusionFilterN;
                              _local_1ab8 = ZEXT416((uint)fVar183);
                              local_1b28 = auVar83;
                              args.ray = (RTCRayN *)ray;
                              if (pRVar31 != (RTCRayN *)0x0) {
                                pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                                fVar183 = (float)local_1ab8._0_4_;
                              }
                              if (local_1b28 == (undefined1  [16])0x0) {
                                auVar99._8_4_ = 0xffffffff;
                                auVar99._0_8_ = 0xffffffffffffffff;
                                auVar99._12_4_ = 0xffffffff;
                                auVar99 = auVar99 ^ _DAT_01febe20;
                              }
                              else {
                                p_Var4 = context->args->filter;
                                if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var4)(&args);
                                  fVar183 = (float)local_1ab8._0_4_;
                                }
                                auVar73._0_4_ = -(uint)(local_1b28._0_4_ == 0);
                                auVar73._4_4_ = -(uint)(local_1b28._4_4_ == 0);
                                auVar73._8_4_ = -(uint)(local_1b28._8_4_ == 0);
                                auVar73._12_4_ = -(uint)(local_1b28._12_4_ == 0);
                                auVar99 = auVar73 ^ _DAT_01febe20;
                                auVar108 = blendvps((undefined1  [16])_DAT_01feba00,
                                                    *(undefined1 (*) [16])(args.ray + 0x80),auVar73)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0x80) = auVar108;
                                pRVar31 = args.ray;
                              }
                              uVar25 = (uint)pRVar31;
                              auVar103._0_4_ = auVar99._0_4_ << 0x1f;
                              auVar103._4_4_ = auVar99._4_4_ << 0x1f;
                              auVar103._8_4_ = auVar99._8_4_ << 0x1f;
                              auVar103._12_4_ = auVar99._12_4_ << 0x1f;
                              auVar83._0_4_ = auVar103._0_4_ >> 0x1f;
                              auVar83._4_4_ = auVar103._4_4_ >> 0x1f;
                              auVar83._8_4_ = auVar103._8_4_ >> 0x1f;
                              auVar83._12_4_ = auVar103._12_4_ >> 0x1f;
                              auVar108 = blendvps(_local_1ac8,*(undefined1 (*) [16])(ray + 0x80),
                                                  auVar103);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar108;
                              auVar108 = _local_1aa8;
                              auVar154 = _local_1aa8;
                            }
                            _local_1aa8 = auVar154;
                            fVar147 = auVar108._0_4_;
                            local_1c28 = ~auVar83 & local_1c28;
                            auVar108 = _local_1aa8;
                          }
                          _local_1aa8 = auVar108;
                          iVar26 = movmskps(uVar25,local_1c28);
                          if (iVar26 == 0) {
                            uVar25 = 0;
                          }
                          else {
                            fVar148 = *(float *)ray;
                            fVar93 = *(float *)(ray + 4);
                            fVar55 = *(float *)(ray + 8);
                            fVar76 = *(float *)(ray + 0xc);
                            fVar77 = *(float *)(ray + 0x10);
                            fVar92 = *(float *)(ray + 0x14);
                            fVar105 = *(float *)(ray + 0x18);
                            fVar106 = *(float *)(ray + 0x1c);
                            fVar107 = *(float *)(ray + 0x20);
                            fVar113 = *(float *)(ray + 0x24);
                            fVar116 = *(float *)(ray + 0x28);
                            fVar127 = *(float *)(ray + 0x2c);
                            fVar161 = auVar159._0_4_ - fVar148;
                            fVar163 = auVar159._4_4_ - fVar93;
                            fVar165 = auVar159._8_4_ - fVar55;
                            fVar168 = auVar159._12_4_ - fVar76;
                            fVar214 = auVar137._0_4_ - fVar77;
                            fVar115 = auVar137._4_4_ - fVar92;
                            fVar118 = auVar137._8_4_ - fVar105;
                            fVar120 = auVar137._12_4_ - fVar106;
                            fVar238 = fVar238 - fVar107;
                            fVar240 = fVar240 - fVar113;
                            fVar242 = fVar242 - fVar116;
                            fVar244 = fVar244 - fVar127;
                            fVar217 = fVar217 - fVar148;
                            fVar220 = fVar220 - fVar93;
                            fVar222 = fVar222 - fVar55;
                            fVar224 = fVar224 - fVar76;
                            fVar149 = fVar149 - fVar77;
                            fVar160 = fVar160 - fVar92;
                            fVar162 = fVar162 - fVar105;
                            fVar164 = fVar164 - fVar106;
                            fVar114 = local_1a98 - fVar107;
                            fVar117 = fStack_1a94 - fVar113;
                            fVar119 = fStack_1a90 - fVar116;
                            fVar122 = fStack_1a8c - fVar127;
                            fVar148 = (fVar183 * fVar78 + fVar196 * fVar140) - fVar148;
                            fVar93 = (fVar183 * fVar184 + fVar196 * fVar121) - fVar93;
                            fVar55 = (fVar183 * fVar192 + fVar196 * fVar131) - fVar55;
                            fVar76 = (fVar183 * fVar201 + fVar196 * fVar133) - fVar76;
                            fVar77 = (fVar147 * fVar78 + fVar200 * fVar140) - fVar77;
                            fVar92 = (fVar147 * fVar184 + fVar200 * fVar121) - fVar92;
                            fVar105 = (fVar147 * fVar192 + fVar200 * fVar131) - fVar105;
                            fVar106 = (fVar147 * fVar201 + fVar200 * fVar133) - fVar106;
                            fVar107 = (fVar191 * fVar78 + fVar146 * fVar140) - fVar107;
                            fVar113 = (fVar191 * fVar184 + fVar146 * fVar121) - fVar113;
                            fVar116 = (fVar191 * fVar192 + fVar146 * fVar131) - fVar116;
                            fVar127 = (fVar191 * fVar201 + fVar146 * fVar133) - fVar127;
                            fVar128 = fVar148 - fVar161;
                            fVar130 = fVar93 - fVar163;
                            fVar132 = fVar55 - fVar165;
                            fVar150 = fVar76 - fVar168;
                            fVar187 = fVar77 - fVar214;
                            fVar195 = fVar92 - fVar115;
                            fVar199 = fVar105 - fVar118;
                            fVar204 = fVar106 - fVar120;
                            local_1aa8._0_4_ = fVar107 - fVar238;
                            local_1aa8._4_4_ = fVar113 - fVar240;
                            fStack_1aa0 = fVar116 - fVar242;
                            fStack_1a9c = fVar127 - fVar244;
                            fVar183 = *(float *)(ray + 0x60);
                            fVar191 = *(float *)(ray + 100);
                            fVar196 = *(float *)(ray + 0x68);
                            fVar200 = *(float *)(ray + 0x6c);
                            fVar179 = fVar161 - fVar217;
                            fVar181 = fVar163 - fVar220;
                            fVar182 = fVar165 - fVar222;
                            fVar186 = fVar168 - fVar224;
                            local_1c38 = (float)*(undefined8 *)(ray + 0x50);
                            fStack_1c34 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
                            fStack_1c30 = (float)*(undefined8 *)(ray + 0x58);
                            fStack_1c2c = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                            fVar129 = fVar214 - fVar149;
                            fVar138 = fVar115 - fVar160;
                            fVar139 = fVar118 - fVar162;
                            fVar209 = fVar120 - fVar164;
                            local_1bd8 = (float)*(undefined8 *)(ray + 0x40);
                            fStack_1bd4 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
                            fStack_1bd0 = (float)*(undefined8 *)(ray + 0x48);
                            fStack_1bcc = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
                            local_1a98 = (fVar187 * (fVar107 + fVar238) -
                                         (fVar77 + fVar214) * (float)local_1aa8._0_4_) * local_1bd8
                                         + ((fVar148 + fVar161) * (float)local_1aa8._0_4_ -
                                           (fVar107 + fVar238) * fVar128) * local_1c38 +
                                           (fVar128 * (fVar77 + fVar214) -
                                           (fVar148 + fVar161) * fVar187) * fVar183;
                            fStack_1a94 = (fVar195 * (fVar113 + fVar240) -
                                          (fVar92 + fVar115) * (float)local_1aa8._4_4_) *
                                          fStack_1bd4 +
                                          ((fVar93 + fVar163) * (float)local_1aa8._4_4_ -
                                          (fVar113 + fVar240) * fVar130) * fStack_1c34 +
                                          (fVar130 * (fVar92 + fVar115) -
                                          (fVar93 + fVar163) * fVar195) * fVar191;
                            fStack_1a90 = (fVar199 * (fVar116 + fVar242) -
                                          (fVar105 + fVar118) * fStack_1aa0) * fStack_1bd0 +
                                          ((fVar55 + fVar165) * fStack_1aa0 -
                                          (fVar116 + fVar242) * fVar132) * fStack_1c30 +
                                          (fVar132 * (fVar105 + fVar118) -
                                          (fVar55 + fVar165) * fVar199) * fVar196;
                            fStack_1a8c = (fVar204 * (fVar127 + fVar244) -
                                          (fVar106 + fVar120) * fStack_1a9c) * fStack_1bcc +
                                          ((fVar76 + fVar168) * fStack_1a9c -
                                          (fVar127 + fVar244) * fVar150) * fStack_1c2c +
                                          (fVar150 * (fVar106 + fVar120) -
                                          (fVar76 + fVar168) * fVar204) * fVar200;
                            local_1ab8._0_4_ = fVar238 - fVar114;
                            local_1ab8._4_4_ = fVar240 - fVar117;
                            fStack_1ab0 = fVar242 - fVar119;
                            fStack_1aac = fVar244 - fVar122;
                            fVar146 = (fVar129 * (fVar238 + fVar114) -
                                      (fVar214 + fVar149) * (float)local_1ab8._0_4_) * local_1bd8 +
                                      ((fVar161 + fVar217) * (float)local_1ab8._0_4_ -
                                      (fVar238 + fVar114) * fVar179) * local_1c38 +
                                      (fVar179 * (fVar214 + fVar149) - (fVar161 + fVar217) * fVar129
                                      ) * fVar183;
                            fVar147 = (fVar138 * (fVar240 + fVar117) -
                                      (fVar115 + fVar160) * (float)local_1ab8._4_4_) * fStack_1bd4 +
                                      ((fVar163 + fVar220) * (float)local_1ab8._4_4_ -
                                      (fVar240 + fVar117) * fVar181) * fStack_1c34 +
                                      (fVar181 * (fVar115 + fVar160) - (fVar163 + fVar220) * fVar138
                                      ) * fVar191;
                            auVar136._0_8_ = CONCAT44(fVar147,fVar146);
                            auVar136._8_4_ =
                                 (fVar139 * (fVar242 + fVar119) - (fVar118 + fVar162) * fStack_1ab0)
                                 * fStack_1bd0 +
                                 ((fVar165 + fVar222) * fStack_1ab0 - (fVar242 + fVar119) * fVar182)
                                 * fStack_1c30 +
                                 (fVar182 * (fVar118 + fVar162) - (fVar165 + fVar222) * fVar139) *
                                 fVar196;
                            auVar136._12_4_ =
                                 (fVar209 * (fVar244 + fVar122) - (fVar120 + fVar164) * fStack_1aac)
                                 * fStack_1bcc +
                                 ((fVar168 + fVar224) * fStack_1aac - (fVar244 + fVar122) * fVar186)
                                 * fStack_1c2c +
                                 (fVar186 * (fVar120 + fVar164) - (fVar168 + fVar224) * fVar209) *
                                 fVar200;
                            fVar169 = fVar217 - fVar148;
                            fVar175 = fVar220 - fVar93;
                            fVar176 = fVar222 - fVar55;
                            fVar178 = fVar224 - fVar76;
                            fVar194 = fVar149 - fVar77;
                            fVar198 = fVar160 - fVar92;
                            fVar203 = fVar162 - fVar105;
                            fVar205 = fVar164 - fVar106;
                            auVar144._0_4_ = fVar114 - fVar107;
                            auVar144._4_4_ = fVar117 - fVar113;
                            auVar144._8_4_ = fVar119 - fVar116;
                            auVar144._12_4_ = fVar122 - fVar127;
                            auVar68._0_4_ =
                                 (fVar194 * (fVar107 + fVar114) -
                                 (fVar77 + fVar149) * auVar144._0_4_) * local_1bd8 +
                                 ((fVar148 + fVar217) * auVar144._0_4_ -
                                 (fVar107 + fVar114) * fVar169) * local_1c38 +
                                 (fVar169 * (fVar77 + fVar149) - (fVar148 + fVar217) * fVar194) *
                                 fVar183;
                            auVar68._4_4_ =
                                 (fVar198 * (fVar113 + fVar117) -
                                 (fVar92 + fVar160) * auVar144._4_4_) * fStack_1bd4 +
                                 ((fVar93 + fVar220) * auVar144._4_4_ -
                                 (fVar113 + fVar117) * fVar175) * fStack_1c34 +
                                 (fVar175 * (fVar92 + fVar160) - (fVar93 + fVar220) * fVar198) *
                                 fVar191;
                            auVar68._8_4_ =
                                 (fVar203 * (fVar116 + fVar119) -
                                 (fVar105 + fVar162) * auVar144._8_4_) * fStack_1bd0 +
                                 ((fVar55 + fVar222) * auVar144._8_4_ -
                                 (fVar116 + fVar119) * fVar176) * fStack_1c30 +
                                 (fVar176 * (fVar105 + fVar162) - (fVar55 + fVar222) * fVar203) *
                                 fVar196;
                            auVar68._12_4_ =
                                 (fVar205 * (fVar127 + fVar122) -
                                 (fVar106 + fVar164) * auVar144._12_4_) * fStack_1bcc +
                                 ((fVar76 + fVar224) * auVar144._12_4_ -
                                 (fVar127 + fVar122) * fVar178) * fStack_1c2c +
                                 (fVar178 * (fVar106 + fVar164) - (fVar76 + fVar224) * fVar205) *
                                 fVar200;
                            fVar146 = local_1a98 + fVar146 + auVar68._0_4_;
                            fVar147 = fStack_1a94 + fVar147 + auVar68._4_4_;
                            auVar96._0_8_ = CONCAT44(fVar147,fVar146);
                            auVar96._8_4_ = fStack_1a90 + auVar136._8_4_ + auVar68._8_4_;
                            auVar96._12_4_ = fStack_1a8c + auVar136._12_4_ + auVar68._12_4_;
                            auVar84._4_4_ = fStack_1a94;
                            auVar84._0_4_ = local_1a98;
                            auVar84._8_4_ = fStack_1a90;
                            auVar84._12_4_ = fStack_1a8c;
                            auVar108 = minps(auVar84,auVar136);
                            auVar108 = minps(auVar108,auVar68);
                            auVar123._4_4_ = fStack_1a94;
                            auVar123._0_4_ = local_1a98;
                            auVar123._8_4_ = fStack_1a90;
                            auVar123._12_4_ = fStack_1a8c;
                            auVar154 = maxps(auVar123,auVar136);
                            auVar154 = maxps(auVar154,auVar68);
                            fVar146 = ABS(fVar146) * 1.1920929e-07;
                            fVar147 = ABS(fVar147) * 1.1920929e-07;
                            auVar124._0_8_ =
                                 CONCAT44(-(uint)(auVar154._4_4_ <= fVar147 ||
                                                 -fVar147 <= auVar108._4_4_) & local_1c28._4_4_,
                                          -(uint)(auVar154._0_4_ <= fVar146 ||
                                                 -fVar146 <= auVar108._0_4_) & local_1c28._0_4_);
                            auVar124._8_4_ =
                                 -(uint)(auVar154._8_4_ <= ABS(auVar96._8_4_) * 1.1920929e-07 ||
                                        -(ABS(auVar96._8_4_) * 1.1920929e-07) <= auVar108._8_4_) &
                                 local_1c28._8_4_;
                            auVar124._12_4_ =
                                 -(uint)(auVar154._12_4_ <= ABS(auVar96._12_4_) * 1.1920929e-07 ||
                                        -(ABS(auVar96._12_4_) * 1.1920929e-07) <= auVar108._12_4_) &
                                 local_1c28._12_4_;
                            iVar26 = movmskps(iVar26,auVar124);
                            uVar25 = (uint)DAT_01fec6c0;
                            uVar167 = DAT_01fec6c0._4_4_;
                            uVar174 = DAT_01fec6c0._8_4_;
                            uVar177 = DAT_01fec6c0._12_4_;
                            if (iVar26 == 0) {
                              auVar158._8_4_ = auVar124._8_4_;
                              auVar158._0_8_ = auVar124._0_8_;
                              auVar158._12_4_ = auVar124._12_4_;
                            }
                            else {
                              auVar110._0_4_ =
                                   fVar187 * (float)local_1ab8._0_4_ -
                                   fVar129 * (float)local_1aa8._0_4_;
                              auVar110._4_4_ =
                                   fVar195 * (float)local_1ab8._4_4_ -
                                   fVar138 * (float)local_1aa8._4_4_;
                              auVar110._8_4_ = fVar199 * fStack_1ab0 - fVar139 * fStack_1aa0;
                              auVar110._12_4_ = fVar204 * fStack_1aac - fVar209 * fStack_1a9c;
                              auVar190._0_4_ =
                                   fVar129 * auVar144._0_4_ - fVar194 * (float)local_1ab8._0_4_;
                              auVar190._4_4_ =
                                   fVar138 * auVar144._4_4_ - fVar198 * (float)local_1ab8._4_4_;
                              auVar190._8_4_ = fVar139 * auVar144._8_4_ - fVar203 * fStack_1ab0;
                              auVar190._12_4_ = fVar209 * auVar144._12_4_ - fVar205 * fStack_1aac;
                              auVar69._4_4_ =
                                   -(uint)((float)((uint)(fVar138 * (float)local_1aa8._4_4_) &
                                                  uVar167) <
                                          (float)((uint)(fVar198 * (float)local_1ab8._4_4_) &
                                                 uVar167));
                              auVar69._0_4_ =
                                   -(uint)((float)((uint)(fVar129 * (float)local_1aa8._0_4_) &
                                                  uVar25) <
                                          (float)((uint)(fVar194 * (float)local_1ab8._0_4_) & uVar25
                                                 ));
                              auVar69._8_4_ =
                                   -(uint)((float)((uint)(fVar139 * fStack_1aa0) & uVar174) <
                                          (float)((uint)(fVar203 * fStack_1ab0) & uVar174));
                              auVar69._12_4_ =
                                   -(uint)((float)((uint)(fVar209 * fStack_1a9c) & uVar177) <
                                          (float)((uint)(fVar205 * fStack_1aac) & uVar177));
                              auVar79 = blendvps(auVar190,auVar110,auVar69);
                              auVar172._0_4_ =
                                   fVar169 * (float)local_1ab8._0_4_ - fVar179 * auVar144._0_4_;
                              auVar172._4_4_ =
                                   fVar175 * (float)local_1ab8._4_4_ - fVar181 * auVar144._4_4_;
                              auVar172._8_4_ = fVar176 * fStack_1ab0 - fVar182 * auVar144._8_4_;
                              auVar172._12_4_ = fVar178 * fStack_1aac - fVar186 * auVar144._12_4_;
                              auVar70._4_4_ =
                                   -(uint)((float)((uint)(fVar130 * (float)local_1ab8._4_4_) &
                                                  uVar167) <
                                          (float)((uint)(fVar181 * auVar144._4_4_) & uVar167));
                              auVar70._0_4_ =
                                   -(uint)((float)((uint)(fVar128 * (float)local_1ab8._0_4_) &
                                                  uVar25) <
                                          (float)((uint)(fVar179 * auVar144._0_4_) & uVar25));
                              auVar70._8_4_ =
                                   -(uint)((float)((uint)(fVar132 * fStack_1ab0) & uVar174) <
                                          (float)((uint)(fVar182 * auVar144._8_4_) & uVar174));
                              auVar70._12_4_ =
                                   -(uint)((float)((uint)(fVar150 * fStack_1aac) & uVar177) <
                                          (float)((uint)(fVar186 * auVar144._12_4_) & uVar177));
                              auVar15._4_4_ =
                                   (float)local_1aa8._4_4_ * fVar181 -
                                   fVar130 * (float)local_1ab8._4_4_;
                              auVar15._0_4_ =
                                   (float)local_1aa8._0_4_ * fVar179 -
                                   fVar128 * (float)local_1ab8._0_4_;
                              auVar15._8_4_ = fStack_1aa0 * fVar182 - fVar132 * fStack_1ab0;
                              auVar15._12_4_ = fStack_1a9c * fVar186 - fVar150 * fStack_1aac;
                              auVar57 = blendvps(auVar172,auVar15,auVar70);
                              auVar219._0_4_ = fVar128 * fVar129 - fVar179 * fVar187;
                              auVar219._4_4_ = fVar130 * fVar138 - fVar181 * fVar195;
                              auVar219._8_4_ = fVar132 * fVar139 - fVar182 * fVar199;
                              auVar219._12_4_ = fVar150 * fVar209 - fVar186 * fVar204;
                              auVar145._0_4_ = fVar179 * fVar194 - fVar169 * fVar129;
                              auVar145._4_4_ = fVar181 * fVar198 - fVar175 * fVar138;
                              auVar145._8_4_ = fVar182 * fVar203 - fVar176 * fVar139;
                              auVar145._12_4_ = fVar186 * fVar205 - fVar178 * fVar209;
                              auVar71._4_4_ =
                                   -(uint)((float)((uint)(fVar181 * fVar195) & uVar167) <
                                          (float)((uint)(fVar175 * fVar138) & uVar167));
                              auVar71._0_4_ =
                                   -(uint)((float)((uint)(fVar179 * fVar187) & uVar25) <
                                          (float)((uint)(fVar169 * fVar129) & uVar25));
                              auVar71._8_4_ =
                                   -(uint)((float)((uint)(fVar182 * fVar199) & uVar174) <
                                          (float)((uint)(fVar176 * fVar139) & uVar174));
                              auVar71._12_4_ =
                                   -(uint)((float)((uint)(fVar186 * fVar204) & uVar177) <
                                          (float)((uint)(fVar178 * fVar209) & uVar177));
                              auVar154 = blendvps(auVar145,auVar219,auVar71);
                              fVar183 = local_1bd8 * auVar79._0_4_ +
                                        local_1c38 * auVar57._0_4_ + fVar183 * auVar154._0_4_;
                              fVar191 = fStack_1bd4 * auVar79._4_4_ +
                                        fStack_1c34 * auVar57._4_4_ + fVar191 * auVar154._4_4_;
                              fVar196 = fStack_1bd0 * auVar79._8_4_ +
                                        fStack_1c30 * auVar57._8_4_ + fVar196 * auVar154._8_4_;
                              fVar200 = fStack_1bcc * auVar79._12_4_ +
                                        fStack_1c2c * auVar57._12_4_ + fVar200 * auVar154._12_4_;
                              auVar156._0_4_ = fVar183 + fVar183;
                              auVar156._4_4_ = fVar191 + fVar191;
                              auVar156._8_4_ = fVar196 + fVar196;
                              auVar156._12_4_ = fVar200 + fVar200;
                              auVar85._0_4_ = fVar238 * auVar154._0_4_;
                              auVar85._4_4_ = fVar240 * auVar154._4_4_;
                              auVar85._8_4_ = fVar242 * auVar154._8_4_;
                              auVar85._12_4_ = fVar244 * auVar154._12_4_;
                              fVar146 = fVar161 * auVar79._0_4_ +
                                        fVar214 * auVar57._0_4_ + auVar85._0_4_;
                              fVar147 = fVar163 * auVar79._4_4_ +
                                        fVar115 * auVar57._4_4_ + auVar85._4_4_;
                              fVar148 = fVar165 * auVar79._8_4_ +
                                        fVar118 * auVar57._8_4_ + auVar85._8_4_;
                              fVar93 = fVar168 * auVar79._12_4_ +
                                       fVar120 * auVar57._12_4_ + auVar85._12_4_;
                              auVar108 = rcpps(auVar85,auVar156);
                              fVar183 = auVar108._0_4_;
                              fVar191 = auVar108._4_4_;
                              fVar196 = auVar108._8_4_;
                              fVar200 = auVar108._12_4_;
                              fVar183 = ((1.0 - auVar156._0_4_ * fVar183) * fVar183 + fVar183) *
                                        (fVar146 + fVar146);
                              fVar191 = ((1.0 - auVar156._4_4_ * fVar191) * fVar191 + fVar191) *
                                        (fVar147 + fVar147);
                              fVar196 = ((1.0 - auVar156._8_4_ * fVar196) * fVar196 + fVar196) *
                                        (fVar148 + fVar148);
                              fVar200 = ((1.0 - auVar156._12_4_ * fVar200) * fVar200 + fVar200) *
                                        (fVar93 + fVar93);
                              auVar157._0_4_ =
                                   (int)((uint)(auVar156._0_4_ != 0.0 &&
                                               (fVar183 <= *(float *)(ray + 0x80) &&
                                               *(float *)(ray + 0x30) <= fVar183)) * -0x80000000) >>
                                   0x1f;
                              auVar157._4_4_ =
                                   (int)((uint)(auVar156._4_4_ != 0.0 &&
                                               (fVar191 <= *(float *)(ray + 0x84) &&
                                               *(float *)(ray + 0x34) <= fVar191)) * -0x80000000) >>
                                   0x1f;
                              auVar157._8_4_ =
                                   (int)((uint)(auVar156._8_4_ != 0.0 &&
                                               (fVar196 <= *(float *)(ray + 0x88) &&
                                               *(float *)(ray + 0x38) <= fVar196)) * -0x80000000) >>
                                   0x1f;
                              auVar157._12_4_ =
                                   (int)((uint)(auVar156._12_4_ != 0.0 &&
                                               (fVar200 <= *(float *)(ray + 0x8c) &&
                                               *(float *)(ray + 0x3c) <= fVar200)) * -0x80000000) >>
                                   0x1f;
                              auVar158 = auVar157 & auVar124;
                              iVar26 = movmskps(iVar26,auVar158);
                              _local_1ac8 = auVar144;
                              if (iVar26 != 0) {
                                local_1788 = CONCAT44(fStack_1a94,local_1a98);
                                uStack_1780 = CONCAT44(fStack_1a8c,fStack_1a90);
                                uStack_19e0 = auVar136._8_8_;
                                uStack_1790 = uStack_19e0;
                                uStack_19f0 = auVar96._8_8_;
                                uStack_17a0 = uStack_19f0;
                                local_17e8 = auVar154;
                                local_17d8 = auVar57;
                                local_17c8 = auVar79;
                                local_17b8 = fVar183;
                                fStack_17b4 = fVar191;
                                fStack_17b0 = fVar196;
                                fStack_17ac = fVar200;
                                local_17a8 = auVar96._0_8_;
                                local_1798 = auVar136._0_8_;
                              }
                            }
                            uVar180 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                            pRVar2 = (context->scene->geometries).items;
                            pGVar3 = pRVar2[uVar180].ptr;
                            uVar185 = pGVar3->mask;
                            auVar86._0_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x90)) == 0);
                            auVar86._4_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x94)) == 0);
                            auVar86._8_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x98)) == 0);
                            auVar86._12_4_ = -(uint)((uVar185 & *(uint *)(ray + 0x9c)) == 0);
                            auVar87 = ~auVar86 & auVar158;
                            iVar26 = movmskps((int)pRVar2,auVar87);
                            if (iVar26 != 0) {
                              uVar33 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                 (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                auVar19._8_8_ = uStack_17a0;
                                auVar19._0_8_ = local_17a8;
                                fVar146 = (float)((ulong)local_17a8 >> 0x20);
                                fVar147 = (float)((ulong)uStack_17a0 >> 0x20);
                                auVar108 = rcpps(ZEXT416(uVar185),auVar19);
                                fVar183 = auVar108._0_4_;
                                fVar191 = auVar108._4_4_;
                                fVar196 = auVar108._8_4_;
                                fVar200 = auVar108._12_4_;
                                fVar183 = (float)(-(uint)(1e-18 <= (float)((uint)(float)local_17a8 &
                                                                          uVar25)) &
                                                 (uint)(((float)DAT_01feca10 -
                                                        (float)local_17a8 * fVar183) * fVar183 +
                                                       fVar183));
                                fVar191 = (float)(-(uint)(1e-18 <= (float)((uint)fVar146 & uVar167))
                                                 & (uint)((DAT_01feca10._4_4_ - fVar146 * fVar191) *
                                                          fVar191 + fVar191));
                                fVar196 = (float)(-(uint)(1e-18 <= (float)((uint)(float)uStack_17a0
                                                                          & uVar174)) &
                                                 (uint)((DAT_01feca10._8_4_ -
                                                        (float)uStack_17a0 * fVar196) * fVar196 +
                                                       fVar196));
                                fVar200 = (float)(-(uint)(1e-18 <= (float)((uint)fVar147 & uVar177))
                                                 & (uint)((DAT_01feca10._12_4_ - fVar147 * fVar200)
                                                          * fVar200 + fVar200));
                                auVar74._0_4_ = (float)local_1788 * fVar183;
                                auVar74._4_4_ = local_1788._4_4_ * fVar191;
                                auVar74._8_4_ = (float)uStack_1780 * fVar196;
                                auVar74._12_4_ = uStack_1780._4_4_ * fVar200;
                                auVar108 = minps(auVar74,_DAT_01feca10);
                                auVar100._0_4_ = fVar183 * (float)local_1798;
                                auVar100._4_4_ = fVar191 * local_1798._4_4_;
                                auVar100._8_4_ = fVar196 * (float)uStack_1790;
                                auVar100._12_4_ = fVar200 * uStack_1790._4_4_;
                                auVar154 = minps(auVar100,_DAT_01feca10);
                                uVar25 = *(uint *)(local_1b10 + lVar51 + 0x2c);
                                uVar167 = *(uint *)(local_1b10 + lVar51 + 0x30);
                                auVar126._4_4_ = uVar25;
                                auVar126._0_4_ = uVar25;
                                auVar126._8_4_ = uVar25;
                                auVar126._12_4_ = uVar25;
                                auVar112._4_4_ = uVar167;
                                auVar112._0_4_ = uVar167;
                                auVar112._8_4_ = uVar167;
                                auVar112._12_4_ = uVar167;
                                auVar57 = pblendw(auVar126,(undefined1  [16])0x0,0xaa);
                                fVar105 = (float)DAT_0201c970;
                                fVar106 = DAT_0201c970._4_4_;
                                fVar107 = DAT_0201c970._8_4_;
                                fVar113 = DAT_0201c970._12_4_;
                                fVar183 = auVar108._0_4_;
                                fVar191 = auVar108._4_4_;
                                fVar196 = auVar108._8_4_;
                                fVar200 = auVar108._12_4_;
                                fVar146 = auVar154._0_4_;
                                fVar55 = ((float)DAT_01feca10 - fVar183) - fVar146;
                                fVar147 = auVar154._4_4_;
                                fVar76 = (DAT_01feca10._4_4_ - fVar191) - fVar147;
                                fVar148 = auVar154._8_4_;
                                fVar77 = (DAT_01feca10._8_4_ - fVar196) - fVar148;
                                fVar93 = auVar154._12_4_;
                                fVar92 = (DAT_01feca10._12_4_ - fVar200) - fVar93;
                                auVar154 = pblendw(auVar112,(undefined1  [16])0x0,0xaa);
                                uVar174 = *(uint *)(local_1be0 + lVar51);
                                auVar101._4_4_ = uVar174;
                                auVar101._0_4_ = uVar174;
                                auVar101._8_4_ = uVar174;
                                auVar101._12_4_ = uVar174;
                                auVar108 = pblendw(auVar101,(undefined1  [16])0x0,0xaa);
                                local_1998 = local_17c8._0_8_;
                                uStack_1990 = local_17c8._8_8_;
                                local_1988 = local_17d8._0_8_;
                                uStack_1980 = local_17d8._8_8_;
                                local_1978 = local_17e8;
                                local_1968 = (float)auVar108._0_4_ * fVar105 * fVar183 +
                                             (float)auVar154._0_4_ * fVar105 * fVar146 +
                                             (float)auVar57._0_4_ * fVar105 * fVar55;
                                fStack_1964 = (float)auVar108._4_4_ * fVar106 * fVar191 +
                                              (float)auVar154._4_4_ * fVar106 * fVar147 +
                                              (float)auVar57._4_4_ * fVar106 * fVar76;
                                fStack_1960 = (float)auVar108._8_4_ * fVar107 * fVar196 +
                                              (float)auVar154._8_4_ * fVar107 * fVar148 +
                                              (float)auVar57._8_4_ * fVar107 * fVar77;
                                fStack_195c = (float)auVar108._12_4_ * fVar113 * fVar200 +
                                              (float)auVar154._12_4_ * fVar113 * fVar93 +
                                              (float)auVar57._12_4_ * fVar113 * fVar92;
                                local_1958 = (float)(uVar174 >> 0x10) * fVar105 * fVar183 +
                                             (float)(uVar167 >> 0x10) * fVar105 * fVar146 +
                                             fVar55 * (float)(uVar25 >> 0x10) * fVar105;
                                fStack_1954 = (float)(uVar174 >> 0x10) * fVar106 * fVar191 +
                                              (float)(uVar167 >> 0x10) * fVar106 * fVar147 +
                                              fVar76 * (float)(uVar25 >> 0x10) * fVar106;
                                fStack_1950 = (float)(uVar174 >> 0x10) * fVar107 * fVar196 +
                                              (float)(uVar167 >> 0x10) * fVar107 * fVar148 +
                                              fVar77 * (float)(uVar25 >> 0x10) * fVar107;
                                fStack_194c = (float)(uVar174 >> 0x10) * fVar113 * fVar200 +
                                              (float)(uVar167 >> 0x10) * fVar113 * fVar93 +
                                              fVar92 * (float)(uVar25 >> 0x10) * fVar113;
                                local_1948 = uVar33;
                                uStack_1944 = uVar33;
                                uStack_1940 = uVar33;
                                uStack_193c = uVar33;
                                local_1938 = uVar180;
                                uStack_1934 = uVar180;
                                uStack_1930 = uVar180;
                                uStack_192c = uVar180;
                                local_1928 = context->user->instID[0];
                                uStack_1924 = local_1928;
                                uStack_1920 = local_1928;
                                uStack_191c = local_1928;
                                local_1918 = context->user->instPrimID[0];
                                uStack_1914 = local_1918;
                                uStack_1910 = local_1918;
                                uStack_190c = local_1918;
                                auVar108 = *(undefined1 (*) [16])(ray + 0x80);
                                auVar18._4_4_ = fStack_17b4;
                                auVar18._0_4_ = local_17b8;
                                auVar18._8_4_ = fStack_17b0;
                                auVar18._12_4_ = fStack_17ac;
                                auVar154 = blendvps(auVar108,auVar18,auVar87);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar154;
                                args.valid = (int *)local_1b28;
                                args.geometryUserPtr = pGVar3->userPtr;
                                args.context = context->user;
                                args.hit = (RTCHitN *)&local_1998;
                                args.N = 4;
                                pRVar31 = (RTCRayN *)pGVar3->occlusionFilterN;
                                local_1b28 = auVar87;
                                args.ray = (RTCRayN *)ray;
                                if (pRVar31 != (RTCRayN *)0x0) {
                                  pRVar31 = (RTCRayN *)(*(code *)pRVar31)(&args);
                                }
                                if (local_1b28 == (undefined1  [16])0x0) {
                                  auVar102._8_4_ = 0xffffffff;
                                  auVar102._0_8_ = 0xffffffffffffffff;
                                  auVar102._12_4_ = 0xffffffff;
                                  auVar102 = auVar102 ^ _DAT_01febe20;
                                }
                                else {
                                  p_Var4 = context->args->filter;
                                  if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var4)(&args);
                                  }
                                  auVar75._0_4_ = -(uint)(local_1b28._0_4_ == 0);
                                  auVar75._4_4_ = -(uint)(local_1b28._4_4_ == 0);
                                  auVar75._8_4_ = -(uint)(local_1b28._8_4_ == 0);
                                  auVar75._12_4_ = -(uint)(local_1b28._12_4_ == 0);
                                  auVar102 = auVar75 ^ _DAT_01febe20;
                                  auVar154 = blendvps((undefined1  [16])_DAT_01feba00,
                                                      *(undefined1 (*) [16])(args.ray + 0x80),
                                                      auVar75);
                                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar154;
                                  pRVar31 = args.ray;
                                }
                                uVar180 = (uint)pRVar31;
                                auVar104._0_4_ = auVar102._0_4_ << 0x1f;
                                auVar104._4_4_ = auVar102._4_4_ << 0x1f;
                                auVar104._8_4_ = auVar102._8_4_ << 0x1f;
                                auVar104._12_4_ = auVar102._12_4_ << 0x1f;
                                auVar87._0_4_ = auVar104._0_4_ >> 0x1f;
                                auVar87._4_4_ = auVar104._4_4_ >> 0x1f;
                                auVar87._8_4_ = auVar104._8_4_ >> 0x1f;
                                auVar87._12_4_ = auVar104._12_4_ >> 0x1f;
                                auVar108 = blendvps(auVar108,*(undefined1 (*) [16])(ray + 0x80),
                                                    auVar104);
                                *(undefined1 (*) [16])(ray + 0x80) = auVar108;
                              }
                              local_1c28 = ~auVar87 & local_1c28;
                            }
                            iVar26 = movmskps(uVar180,local_1c28);
                            uVar25 = CONCAT31((int3)((uint)iVar26 >> 8),iVar26 != 0);
                          }
                          fVar200 = INFINITY;
                          fVar196 = INFINITY;
                          fVar191 = INFINITY;
                          fVar183 = INFINITY;
                          pGVar30 = (GridSOA *)(ulong)uVar25;
                          lVar51 = lVar51 + 4;
                          auVar108 = local_1ad8;
                        } while ((char)uVar25 != '\0');
                        if (local_1adc == 2) break;
                        local_1b10 = local_1b10 + lVar5;
                        local_1ae8 = local_1ae8 + lVar5;
                        local_1af0 = local_1af0 + lVar5;
                        local_1af8 = local_1af8 + lVar5;
                        pGVar28 = pGVar28 + lVar5;
                        pGVar50 = pGVar50 + lVar5;
                        local_1b00 = local_1b00 + lVar5;
                        local_1be0 = local_1be0 + lVar5;
                        pGVar39 = pGVar39 + lVar5;
                        local_1b08 = local_1b08 + lVar5;
                        local_1a30 = local_1a30 + lVar5;
                        local_1a38 = local_1a38 + lVar5;
                        local_1a40 = local_1a40 + lVar5;
                        pGVar41 = pGVar41 + lVar5;
                        bVar54 = local_1a48 == (GridSOA *)0x0;
                        pGVar30 = local_1a48 + 1;
                        local_1a48 = pGVar30;
                      } while (bVar54);
                      local_17f8 = auVar63._0_4_;
                      uStack_17f4 = auVar63._4_4_;
                      uStack_17f0 = auVar63._8_4_;
                      uStack_17ec = auVar63._12_4_;
                      auVar207._0_4_ = auVar108._0_4_ ^ local_17f8;
                      auVar207._4_4_ = auVar108._4_4_ ^ uStack_17f4;
                      auVar207._8_4_ = auVar108._8_4_ ^ uStack_17f0;
                      auVar207._12_4_ = auVar108._12_4_ ^ uStack_17ec;
                      local_1c28 = local_1c28 | auVar95;
                      local_1b88.i[2] = local_1b88._8_4_ & local_1c28._8_4_;
                      local_1b88.i[3] = local_1b88._12_4_ & local_1c28._12_4_;
                      local_1b88.i[1] = local_1b88._4_4_ & local_1c28._4_4_;
                      local_1b88.i[0] = local_1b88._0_4_ & local_1c28._0_4_;
                      uVar25 = movmskps((int)pGVar30,auVar207);
                      pGVar28 = (GridSOA *)(ulong)uVar25;
                    } while (uVar25 != 0);
                    local_1b88._0_8_ = local_1b88._0_8_ ^ 0xffffffffffffffff;
                    local_1b88.i[2] = local_1b88.i[2] ^ 0xffffffff;
                    local_1b88.i[3] = local_1b88.i[3] ^ 0xffffffff;
                  }
                  sVar35 = 0;
                }
                else {
                  pGVar28 = *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                  sVar35 = *(size_t *)pGVar28;
                  local_1b88 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)auVar88;
                  pre.super_Precalculations.grid = pGVar28;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     ((undefined1  [16])local_1b88 | (undefined1  [16])terminated.field_0);
                iVar24 = movmskps((int)pGVar28,(undefined1  [16])terminated.field_0);
                if (iVar24 == 0xf) goto LAB_0025630d;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     blendvps((undefined1  [16])tray.tfar.field_0,(undefined1  [16])_DAT_01feba00,
                              (undefined1  [16])terminated.field_0);
                iVar24 = 0;
                if (sVar35 != 0) {
                  pNVar52->ptr = sVar35;
                  pNVar52 = pNVar52 + 1;
                  *paVar46 = _DAT_01feba00;
                  paVar46 = paVar46 + 1;
                }
                goto LAB_00256310;
              }
              goto LAB_0025631e;
            }
          }
        }
LAB_00256310:
        paVar45 = paVar46;
      } while (iVar24 != 3);
      auVar88._4_4_ = uVar173 & terminated.field_0.i[1];
      auVar88._0_4_ = uVar166 & terminated.field_0.i[0];
      auVar88._8_4_ = auVar170._8_4_ & terminated.field_0.i[2];
      auVar88._12_4_ = auVar170._12_4_ & terminated.field_0.i[3];
      auVar88 = blendvps(*(undefined1 (*) [16])(ray + 0x80),(undefined1  [16])_DAT_01feba00,auVar88)
      ;
      *(undefined1 (*) [16])(ray + 0x80) = auVar88;
    }
  }
  return;
code_r0x002548c1:
  uVar27 = root.ptr & 0xfffffffffffffff0;
  uVar25 = (uint)root.ptr & 7;
  bVar54 = local_1c38 < tray.tfar.field_0.v[0];
  bVar9 = fStack_1c34 < tray.tfar.field_0.v[1];
  bVar10 = fStack_1c30 < tray.tfar.field_0.v[2];
  bVar11 = fStack_1c2c < tray.tfar.field_0.v[3];
  root.ptr = 8;
  pIVar36 = (Intersectors *)0x0;
  local_1c38 = fVar183;
  fStack_1c34 = fVar191;
  fStack_1c30 = fVar196;
  fStack_1c2c = fVar200;
  do {
    sVar35 = *(size_t *)(uVar27 + (long)pIVar36 * 8);
    if (sVar35 != 8) {
      fVar78 = *(float *)(uVar27 + 0x80 + (long)pIVar36 * 4);
      fVar184 = *(float *)(uVar27 + 0x20 + (long)pIVar36 * 4);
      fVar192 = *(float *)(uVar27 + 0x30 + (long)pIVar36 * 4);
      fVar201 = *(float *)(uVar27 + 0x40 + (long)pIVar36 * 4);
      fVar140 = *(float *)(uVar27 + 0x50 + (long)pIVar36 * 4);
      auVar108 = *(undefined1 (*) [16])(ray + 0x70);
      fVar92 = auVar108._0_4_;
      fVar105 = auVar108._4_4_;
      fVar106 = auVar108._8_4_;
      fVar107 = auVar108._12_4_;
      fVar121 = *(float *)(uVar27 + 0xa0 + (long)pIVar36 * 4);
      fVar131 = *(float *)(uVar27 + 0xc0 + (long)pIVar36 * 4);
      fVar133 = *(float *)(uVar27 + 0x60 + (long)pIVar36 * 4);
      fVar146 = *(float *)(uVar27 + 0x90 + (long)pIVar36 * 4);
      fVar147 = *(float *)(uVar27 + 0xb0 + (long)pIVar36 * 4);
      fVar148 = *(float *)(uVar27 + 0xd0 + (long)pIVar36 * 4);
      fVar93 = *(float *)(uVar27 + 0x70 + (long)pIVar36 * 4);
      fVar209 = (float)((ulong)tray.org.field_0._32_8_ >> 0x20);
      fVar214 = (float)((ulong)tray.org.field_0._40_8_ >> 0x20);
      fVar55 = ((fVar78 * fVar92 + fVar184) - (float)tray.org.field_0._0_4_) *
               (float)tray.rdir.field_0._0_4_;
      fVar76 = ((fVar78 * fVar105 + fVar184) - (float)tray.org.field_0._4_4_) *
               (float)tray.rdir.field_0._4_4_;
      fVar77 = ((fVar78 * fVar106 + fVar184) - (float)tray.org.field_0._8_4_) *
               (float)tray.rdir.field_0._8_4_;
      fVar78 = ((fVar78 * fVar107 + fVar184) - (float)tray.org.field_0._12_4_) *
               (float)tray.rdir.field_0._12_4_;
      fVar184 = ((fVar121 * fVar92 + fVar201) - (float)tray.org.field_0._16_4_) *
                (float)tray.rdir.field_0._16_4_;
      fVar113 = ((fVar121 * fVar105 + fVar201) - (float)tray.org.field_0._20_4_) *
                (float)tray.rdir.field_0._20_4_;
      fVar116 = ((fVar121 * fVar106 + fVar201) - (float)tray.org.field_0._24_4_) *
                (float)tray.rdir.field_0._24_4_;
      fVar201 = ((fVar121 * fVar107 + fVar201) - (float)tray.org.field_0._28_4_) *
                (float)tray.rdir.field_0._28_4_;
      fVar121 = ((fVar131 * fVar92 + fVar133) - (float)tray.org.field_0._32_8_) *
                (float)tray.rdir.field_0._32_4_;
      fVar127 = ((fVar131 * fVar105 + fVar133) - fVar209) * (float)tray.rdir.field_0._36_4_;
      fVar129 = ((fVar131 * fVar106 + fVar133) - (float)tray.org.field_0._40_8_) *
                (float)tray.rdir.field_0._40_4_;
      fVar131 = ((fVar131 * fVar107 + fVar133) - fVar214) * (float)tray.rdir.field_0._44_4_;
      fVar133 = ((fVar146 * fVar92 + fVar192) - (float)tray.org.field_0._0_4_) *
                (float)tray.rdir.field_0._0_4_;
      fVar138 = ((fVar146 * fVar105 + fVar192) - (float)tray.org.field_0._4_4_) *
                (float)tray.rdir.field_0._4_4_;
      fVar139 = ((fVar146 * fVar106 + fVar192) - (float)tray.org.field_0._8_4_) *
                (float)tray.rdir.field_0._8_4_;
      fVar192 = ((fVar146 * fVar107 + fVar192) - (float)tray.org.field_0._12_4_) *
                (float)tray.rdir.field_0._12_4_;
      fVar149 = ((fVar147 * fVar92 + fVar140) - (float)tray.org.field_0._16_4_) *
                (float)tray.rdir.field_0._16_4_;
      fVar160 = ((fVar147 * fVar105 + fVar140) - (float)tray.org.field_0._20_4_) *
                (float)tray.rdir.field_0._20_4_;
      fVar162 = ((fVar147 * fVar106 + fVar140) - (float)tray.org.field_0._24_4_) *
                (float)tray.rdir.field_0._24_4_;
      fVar164 = ((fVar147 * fVar107 + fVar140) - (float)tray.org.field_0._28_4_) *
                (float)tray.rdir.field_0._28_4_;
      fVar140 = ((fVar148 * fVar92 + fVar93) - (float)tray.org.field_0._32_8_) *
                (float)tray.rdir.field_0._32_4_;
      fVar146 = ((fVar148 * fVar105 + fVar93) - fVar209) * (float)tray.rdir.field_0._36_4_;
      fVar147 = ((fVar148 * fVar106 + fVar93) - (float)tray.org.field_0._40_8_) *
                (float)tray.rdir.field_0._40_4_;
      fVar148 = ((fVar148 * fVar107 + fVar93) - fVar214) * (float)tray.rdir.field_0._44_4_;
      uVar167 = (uint)((int)fVar133 < (int)fVar55) * (int)fVar133 |
                (uint)((int)fVar133 >= (int)fVar55) * (int)fVar55;
      uVar174 = (uint)((int)fVar138 < (int)fVar76) * (int)fVar138 |
                (uint)((int)fVar138 >= (int)fVar76) * (int)fVar76;
      uVar177 = (uint)((int)fVar139 < (int)fVar77) * (int)fVar139 |
                (uint)((int)fVar139 >= (int)fVar77) * (int)fVar77;
      uVar180 = (uint)((int)fVar192 < (int)fVar78) * (int)fVar192 |
                (uint)((int)fVar192 >= (int)fVar78) * (int)fVar78;
      uVar185 = (uint)((int)fVar149 < (int)fVar184) * (int)fVar149 |
                (uint)((int)fVar149 >= (int)fVar184) * (int)fVar184;
      uVar193 = (uint)((int)fVar160 < (int)fVar113) * (int)fVar160 |
                (uint)((int)fVar160 >= (int)fVar113) * (int)fVar113;
      uVar197 = (uint)((int)fVar162 < (int)fVar116) * (int)fVar162 |
                (uint)((int)fVar162 >= (int)fVar116) * (int)fVar116;
      uVar202 = (uint)((int)fVar164 < (int)fVar201) * (int)fVar164 |
                (uint)((int)fVar164 >= (int)fVar201) * (int)fVar201;
      uVar185 = ((int)uVar185 < (int)uVar167) * uVar167 | ((int)uVar185 >= (int)uVar167) * uVar185;
      uVar193 = ((int)uVar193 < (int)uVar174) * uVar174 | ((int)uVar193 >= (int)uVar174) * uVar193;
      uVar197 = ((int)uVar197 < (int)uVar177) * uVar177 | ((int)uVar197 >= (int)uVar177) * uVar197;
      uVar202 = ((int)uVar202 < (int)uVar180) * uVar180 | ((int)uVar202 >= (int)uVar180) * uVar202;
      uVar167 = (uint)((int)fVar140 < (int)fVar121) * (int)fVar140 |
                (uint)((int)fVar140 >= (int)fVar121) * (int)fVar121;
      uVar174 = (uint)((int)fVar146 < (int)fVar127) * (int)fVar146 |
                (uint)((int)fVar146 >= (int)fVar127) * (int)fVar127;
      uVar177 = (uint)((int)fVar147 < (int)fVar129) * (int)fVar147 |
                (uint)((int)fVar147 >= (int)fVar129) * (int)fVar129;
      uVar180 = (uint)((int)fVar148 < (int)fVar131) * (int)fVar148 |
                (uint)((int)fVar148 >= (int)fVar131) * (int)fVar131;
      auVar108._0_4_ =
           ((int)uVar167 < (int)uVar185) * uVar185 | ((int)uVar167 >= (int)uVar185) * uVar167;
      auVar108._4_4_ =
           ((int)uVar174 < (int)uVar193) * uVar193 | ((int)uVar174 >= (int)uVar193) * uVar174;
      auVar108._8_4_ =
           ((int)uVar177 < (int)uVar197) * uVar197 | ((int)uVar177 >= (int)uVar197) * uVar177;
      auVar108._12_4_ =
           ((int)uVar180 < (int)uVar202) * uVar202 | ((int)uVar180 >= (int)uVar202) * uVar180;
      uVar167 = (uint)((int)fVar133 < (int)fVar55) * (int)fVar55 |
                (uint)((int)fVar133 >= (int)fVar55) * (int)fVar133;
      uVar174 = (uint)((int)fVar138 < (int)fVar76) * (int)fVar76 |
                (uint)((int)fVar138 >= (int)fVar76) * (int)fVar138;
      uVar177 = (uint)((int)fVar139 < (int)fVar77) * (int)fVar77 |
                (uint)((int)fVar139 >= (int)fVar77) * (int)fVar139;
      uVar180 = (uint)((int)fVar192 < (int)fVar78) * (int)fVar78 |
                (uint)((int)fVar192 >= (int)fVar78) * (int)fVar192;
      uVar185 = (uint)((int)fVar149 < (int)fVar184) * (int)fVar184 |
                (uint)((int)fVar149 >= (int)fVar184) * (int)fVar149;
      uVar193 = (uint)((int)fVar160 < (int)fVar113) * (int)fVar113 |
                (uint)((int)fVar160 >= (int)fVar113) * (int)fVar160;
      uVar197 = (uint)((int)fVar162 < (int)fVar116) * (int)fVar116 |
                (uint)((int)fVar162 >= (int)fVar116) * (int)fVar162;
      uVar202 = (uint)((int)fVar164 < (int)fVar201) * (int)fVar201 |
                (uint)((int)fVar164 >= (int)fVar201) * (int)fVar164;
      uVar185 = ((int)uVar167 < (int)uVar185) * uVar167 | ((int)uVar167 >= (int)uVar185) * uVar185;
      uVar193 = ((int)uVar174 < (int)uVar193) * uVar174 | ((int)uVar174 >= (int)uVar193) * uVar193;
      uVar197 = ((int)uVar177 < (int)uVar197) * uVar177 | ((int)uVar177 >= (int)uVar197) * uVar197;
      uVar202 = ((int)uVar180 < (int)uVar202) * uVar180 | ((int)uVar180 >= (int)uVar202) * uVar202;
      uVar167 = (uint)((int)fVar140 < (int)fVar121) * (int)fVar121 |
                (uint)((int)fVar140 >= (int)fVar121) * (int)fVar140;
      uVar174 = (uint)((int)fVar146 < (int)fVar127) * (int)fVar127 |
                (uint)((int)fVar146 >= (int)fVar127) * (int)fVar146;
      uVar177 = (uint)((int)fVar147 < (int)fVar129) * (int)fVar129 |
                (uint)((int)fVar147 >= (int)fVar129) * (int)fVar147;
      uVar180 = (uint)((int)fVar148 < (int)fVar131) * (int)fVar131 |
                (uint)((int)fVar148 >= (int)fVar131) * (int)fVar148;
      uVar167 = ((int)uVar185 < (int)uVar167) * uVar185 | ((int)uVar185 >= (int)uVar167) * uVar167;
      uVar174 = ((int)uVar193 < (int)uVar174) * uVar193 | ((int)uVar193 >= (int)uVar174) * uVar174;
      uVar177 = ((int)uVar197 < (int)uVar177) * uVar197 | ((int)uVar197 >= (int)uVar177) * uVar177;
      uVar180 = ((int)uVar202 < (int)uVar180) * uVar202 | ((int)uVar202 >= (int)uVar180) * uVar180;
      bVar53 = (float)((tray.tnear.field_0.i[0] < (int)auVar108._0_4_) * auVar108._0_4_ |
                      (uint)(tray.tnear.field_0.i[0] >= (int)auVar108._0_4_) *
                      tray.tnear.field_0.i[0]) <=
               (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar167) * tray.tfar.field_0.i[0] |
                      (tray.tfar.field_0.i[0] >= (int)uVar167) * uVar167);
      bVar6 = (float)((tray.tnear.field_0.i[1] < (int)auVar108._4_4_) * auVar108._4_4_ |
                     (uint)(tray.tnear.field_0.i[1] >= (int)auVar108._4_4_) *
                     tray.tnear.field_0.i[1]) <=
              (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar174) * tray.tfar.field_0.i[1] |
                     (tray.tfar.field_0.i[1] >= (int)uVar174) * uVar174);
      bVar7 = (float)((tray.tnear.field_0.i[2] < (int)auVar108._8_4_) * auVar108._8_4_ |
                     (uint)(tray.tnear.field_0.i[2] >= (int)auVar108._8_4_) *
                     tray.tnear.field_0.i[2]) <=
              (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar177) * tray.tfar.field_0.i[2] |
                     (tray.tfar.field_0.i[2] >= (int)uVar177) * uVar177);
      bVar8 = (float)((tray.tnear.field_0.i[3] < (int)auVar108._12_4_) * auVar108._12_4_ |
                     (uint)(tray.tnear.field_0.i[3] >= (int)auVar108._12_4_) *
                     tray.tnear.field_0.i[3]) <=
              (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar180) * tray.tfar.field_0.i[3] |
                     (tray.tfar.field_0.i[3] >= (int)uVar180) * uVar180);
      if (uVar25 == 6) {
        fVar78 = *(float *)(uVar27 + 0xe0 + (long)pIVar36 * 4);
        fVar184 = *(float *)(uVar27 + 0xf0 + (long)pIVar36 * 4);
        bVar53 = (fVar92 < fVar184 && fVar78 <= fVar92) && bVar53;
        bVar6 = (fVar105 < fVar184 && fVar78 <= fVar105) && bVar6;
        bVar7 = (fVar106 < fVar184 && fVar78 <= fVar106) && bVar7;
        bVar8 = (fVar107 < fVar184 && fVar78 <= fVar107) && bVar8;
      }
      auVar60._0_4_ = (-(uint)bVar53 & -(uint)bVar54) << 0x1f;
      auVar60._4_4_ = (-(uint)bVar6 & -(uint)bVar9) << 0x1f;
      auVar60._8_4_ = (-(uint)bVar7 & -(uint)bVar10) << 0x1f;
      auVar60._12_4_ = (-(uint)bVar8 & -(uint)bVar11) << 0x1f;
      uVar167 = movmskps((int)valid_i,auVar60);
      valid_i = (vint<4> *)(ulong)uVar167;
      if (uVar167 != 0) {
        auVar94._4_4_ = fVar191;
        auVar94._0_4_ = fVar183;
        auVar94._8_4_ = fVar196;
        auVar94._12_4_ = fVar200;
        auVar108 = blendvps(auVar94,auVar108,auVar60);
        if (root.ptr != 8) {
          pNVar52->ptr = root.ptr;
          pNVar52 = pNVar52 + 1;
          paVar46->v[0] = local_1c38;
          paVar46->v[1] = fStack_1c34;
          paVar46->v[2] = fStack_1c30;
          paVar46->v[3] = fStack_1c2c;
          paVar46 = paVar46 + 1;
        }
        local_1c38 = auVar108._0_4_;
        fStack_1c34 = auVar108._4_4_;
        fStack_1c30 = auVar108._8_4_;
        fStack_1c2c = auVar108._12_4_;
        root.ptr = sVar35;
      }
    }
  } while ((sVar35 != 8) &&
          (valid_i = (vint<4> *)
                     ((long)((anon_union_16_2_9473010e_for_vint_impl<4>_1 *)&pIVar36->ptr)->v + 1),
          bVar53 = pIVar36 < (Intersectors *)0x3, pIVar36 = (Intersectors *)valid_i, bVar53));
  iVar24 = 0;
  if (root.ptr == 8) {
    bVar54 = false;
    iVar24 = 4;
  }
  else {
    auVar61._4_4_ = -(uint)(fStack_1c34 < tray.tfar.field_0.v[1]);
    auVar61._0_4_ = -(uint)(local_1c38 < tray.tfar.field_0.v[0]);
    auVar61._8_4_ = -(uint)(fStack_1c30 < tray.tfar.field_0.v[2]);
    auVar61._12_4_ = -(uint)(fStack_1c2c < tray.tfar.field_0.v[3]);
    uVar33 = movmskps(uVar25,auVar61);
    bVar54 = true;
    if ((uint)POPCOUNT(uVar33) <= uVar32) {
      pNVar52->ptr = root.ptr;
      pNVar52 = pNVar52 + 1;
      paVar46->v[0] = local_1c38;
      paVar46->v[1] = fStack_1c34;
      paVar46->v[2] = fStack_1c30;
      paVar46->v[3] = fStack_1c2c;
      paVar46 = paVar46 + 1;
      bVar54 = false;
      iVar24 = 4;
    }
  }
  if (!bVar54) goto LAB_00256310;
  goto LAB_002548b7;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }